

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  bool bVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  uint uVar51;
  uint uVar52;
  ulong uVar53;
  long lVar55;
  byte bVar56;
  uint uVar57;
  ulong uVar58;
  ulong uVar59;
  float fVar60;
  vint4 bi_2;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined4 uVar61;
  undefined1 auVar69 [16];
  float fVar62;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined8 extraout_XMM1_Qa;
  float fVar96;
  vint4 bi_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar95 [12];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar97;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 extraout_var [56];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  vint4 ai_2;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  vint4 ai;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar137;
  float fVar152;
  float fVar153;
  vint4 bi;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar154;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar151 [32];
  float fVar158;
  undefined8 uVar159;
  float fVar179;
  vfloat4 b0_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar177;
  float fVar180;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar178;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  vint4 ai_1;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  vfloat4 a0_2;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  vfloat4 a0_3;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  float fVar246;
  float fVar258;
  float fVar259;
  vfloat4 a0_1;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar260;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  vfloat4 a0;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar281 [16];
  undefined1 auVar285 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_668 [16];
  float local_608;
  float fStack_604;
  undefined1 local_5a8 [8];
  undefined8 uStack_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 *local_540;
  RTCFilterFunctionNArguments local_538;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  uint auStack_3d8 [4];
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  uint local_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  undefined1 local_3a8 [16];
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar54;
  undefined1 auVar94 [64];
  undefined1 auVar117 [32];
  
  PVar3 = prim[1];
  uVar59 = (ulong)(byte)PVar3;
  fVar60 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar127._0_4_ = fVar60 * auVar9._0_4_;
  auVar127._4_4_ = fVar60 * auVar9._4_4_;
  auVar127._8_4_ = fVar60 * auVar9._8_4_;
  auVar127._12_4_ = fVar60 * auVar9._12_4_;
  auVar138._0_4_ = fVar60 * auVar70._0_4_;
  auVar138._4_4_ = fVar60 * auVar70._4_4_;
  auVar138._8_4_ = fVar60 * auVar70._8_4_;
  auVar138._12_4_ = fVar60 * auVar70._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar276 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar276 = vcvtdq2ps_avx(auVar276);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar59 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar53 = (ulong)(uint)((int)(uVar59 * 9) * 2);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + uVar59 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  uVar53 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar272._4_4_ = auVar138._0_4_;
  auVar272._0_4_ = auVar138._0_4_;
  auVar272._8_4_ = auVar138._0_4_;
  auVar272._12_4_ = auVar138._0_4_;
  auVar74 = vshufps_avx(auVar138,auVar138,0x55);
  auVar205 = vshufps_avx(auVar138,auVar138,0xaa);
  fVar60 = auVar205._0_4_;
  auVar238._0_4_ = fVar60 * auVar276._0_4_;
  fVar137 = auVar205._4_4_;
  auVar238._4_4_ = fVar137 * auVar276._4_4_;
  fVar152 = auVar205._8_4_;
  auVar238._8_4_ = fVar152 * auVar276._8_4_;
  fVar153 = auVar205._12_4_;
  auVar238._12_4_ = fVar153 * auVar276._12_4_;
  auVar225._0_4_ = auVar11._0_4_ * fVar60;
  auVar225._4_4_ = auVar11._4_4_ * fVar137;
  auVar225._8_4_ = auVar11._8_4_ * fVar152;
  auVar225._12_4_ = auVar11._12_4_ * fVar153;
  auVar198._0_4_ = auVar98._0_4_ * fVar60;
  auVar198._4_4_ = auVar98._4_4_ * fVar137;
  auVar198._8_4_ = auVar98._8_4_ * fVar152;
  auVar198._12_4_ = auVar98._12_4_ * fVar153;
  auVar205 = vfmadd231ps_fma(auVar238,auVar74,auVar70);
  auVar75 = vfmadd231ps_fma(auVar225,auVar74,auVar10);
  auVar74 = vfmadd231ps_fma(auVar198,auVar63,auVar74);
  auVar110 = vfmadd231ps_fma(auVar205,auVar272,auVar9);
  auVar75 = vfmadd231ps_fma(auVar75,auVar272,auVar77);
  auVar66 = vfmadd231ps_fma(auVar74,auVar64,auVar272);
  auVar273._4_4_ = auVar127._0_4_;
  auVar273._0_4_ = auVar127._0_4_;
  auVar273._8_4_ = auVar127._0_4_;
  auVar273._12_4_ = auVar127._0_4_;
  auVar74 = vshufps_avx(auVar127,auVar127,0x55);
  auVar205 = vshufps_avx(auVar127,auVar127,0xaa);
  fVar60 = auVar205._0_4_;
  auVar139._0_4_ = fVar60 * auVar276._0_4_;
  fVar137 = auVar205._4_4_;
  auVar139._4_4_ = fVar137 * auVar276._4_4_;
  fVar152 = auVar205._8_4_;
  auVar139._8_4_ = fVar152 * auVar276._8_4_;
  fVar153 = auVar205._12_4_;
  auVar139._12_4_ = fVar153 * auVar276._12_4_;
  auVar73._0_4_ = auVar11._0_4_ * fVar60;
  auVar73._4_4_ = auVar11._4_4_ * fVar137;
  auVar73._8_4_ = auVar11._8_4_ * fVar152;
  auVar73._12_4_ = auVar11._12_4_ * fVar153;
  auVar205._0_4_ = auVar98._0_4_ * fVar60;
  auVar205._4_4_ = auVar98._4_4_ * fVar137;
  auVar205._8_4_ = auVar98._8_4_ * fVar152;
  auVar205._12_4_ = auVar98._12_4_ * fVar153;
  auVar70 = vfmadd231ps_fma(auVar139,auVar74,auVar70);
  auVar276 = vfmadd231ps_fma(auVar73,auVar74,auVar10);
  auVar10 = vfmadd231ps_fma(auVar205,auVar74,auVar63);
  auVar11 = vfmadd231ps_fma(auVar70,auVar273,auVar9);
  auVar63 = vfmadd231ps_fma(auVar276,auVar273,auVar77);
  auVar98 = vfmadd231ps_fma(auVar10,auVar273,auVar64);
  auVar281._8_4_ = 0x7fffffff;
  auVar281._0_8_ = 0x7fffffff7fffffff;
  auVar281._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar110,auVar281);
  auVar120._8_4_ = 0x219392ef;
  auVar120._0_8_ = 0x219392ef219392ef;
  auVar120._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar120,1);
  auVar70 = vblendvps_avx(auVar110,auVar120,auVar9);
  auVar9 = vandps_avx(auVar75,auVar281);
  auVar9 = vcmpps_avx(auVar9,auVar120,1);
  auVar276 = vblendvps_avx(auVar75,auVar120,auVar9);
  auVar9 = vandps_avx(auVar66,auVar281);
  auVar9 = vcmpps_avx(auVar9,auVar120,1);
  auVar9 = vblendvps_avx(auVar66,auVar120,auVar9);
  auVar77 = vrcpps_avx(auVar70);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = &DAT_3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar70 = vfnmadd213ps_fma(auVar70,auVar77,auVar184);
  auVar77 = vfmadd132ps_fma(auVar70,auVar77,auVar77);
  auVar70 = vrcpps_avx(auVar276);
  auVar276 = vfnmadd213ps_fma(auVar276,auVar70,auVar184);
  auVar10 = vfmadd132ps_fma(auVar276,auVar70,auVar70);
  auVar70 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar70,auVar184);
  auVar64 = vfmadd132ps_fma(auVar9,auVar70,auVar70);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar11);
  auVar66._0_4_ = auVar77._0_4_ * auVar9._0_4_;
  auVar66._4_4_ = auVar77._4_4_ * auVar9._4_4_;
  auVar66._8_4_ = auVar77._8_4_ * auVar9._8_4_;
  auVar66._12_4_ = auVar77._12_4_ * auVar9._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar70);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar11);
  auVar140._0_4_ = auVar77._0_4_ * auVar9._0_4_;
  auVar140._4_4_ = auVar77._4_4_ * auVar9._4_4_;
  auVar140._8_4_ = auVar77._8_4_ * auVar9._8_4_;
  auVar140._12_4_ = auVar77._12_4_ * auVar9._12_4_;
  auVar75._1_3_ = 0;
  auVar75[0] = PVar3;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar70 = vpmovsxwd_avx(auVar276);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar59 * -2 + 6);
  auVar9 = vpmovsxwd_avx(auVar77);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar63);
  auVar199._0_4_ = auVar9._0_4_ * auVar10._0_4_;
  auVar199._4_4_ = auVar9._4_4_ * auVar10._4_4_;
  auVar199._8_4_ = auVar9._8_4_ * auVar10._8_4_;
  auVar199._12_4_ = auVar9._12_4_ * auVar10._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar70);
  auVar9 = vsubps_avx(auVar9,auVar63);
  auVar74._0_4_ = auVar10._0_4_ * auVar9._0_4_;
  auVar74._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar74._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar74._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar53 + uVar59 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar98);
  auVar110._0_4_ = auVar64._0_4_ * auVar9._0_4_;
  auVar110._4_4_ = auVar64._4_4_ * auVar9._4_4_;
  auVar110._8_4_ = auVar64._8_4_ * auVar9._8_4_;
  auVar110._12_4_ = auVar64._12_4_ * auVar9._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar11);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar98);
  auVar63._0_4_ = auVar64._0_4_ * auVar9._0_4_;
  auVar63._4_4_ = auVar64._4_4_ * auVar9._4_4_;
  auVar63._8_4_ = auVar64._8_4_ * auVar9._8_4_;
  auVar63._12_4_ = auVar64._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar66,auVar140);
  auVar70 = vpminsd_avx(auVar199,auVar74);
  auVar9 = vmaxps_avx(auVar9,auVar70);
  auVar70 = vpminsd_avx(auVar110,auVar63);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar214._4_4_ = uVar61;
  auVar214._0_4_ = uVar61;
  auVar214._8_4_ = uVar61;
  auVar214._12_4_ = uVar61;
  auVar70 = vmaxps_avx(auVar70,auVar214);
  auVar9 = vmaxps_avx(auVar9,auVar70);
  local_3a8._0_4_ = auVar9._0_4_ * 0.99999964;
  local_3a8._4_4_ = auVar9._4_4_ * 0.99999964;
  local_3a8._8_4_ = auVar9._8_4_ * 0.99999964;
  local_3a8._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar66,auVar140);
  auVar70 = vpmaxsd_avx(auVar199,auVar74);
  auVar9 = vminps_avx(auVar9,auVar70);
  auVar70 = vpmaxsd_avx(auVar110,auVar63);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar98._4_4_ = uVar61;
  auVar98._0_4_ = uVar61;
  auVar98._8_4_ = uVar61;
  auVar98._12_4_ = uVar61;
  auVar70 = vminps_avx(auVar70,auVar98);
  auVar9 = vminps_avx(auVar9,auVar70);
  auVar64._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar64._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar64._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar64._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar75[4] = PVar3;
  auVar75._5_3_ = 0;
  auVar75[8] = PVar3;
  auVar75._9_3_ = 0;
  auVar75[0xc] = PVar3;
  auVar75._13_3_ = 0;
  auVar70 = vpcmpgtd_avx(auVar75,_DAT_01ff0cf0);
  auVar9 = vcmpps_avx(local_3a8,auVar64,2);
  auVar9 = vandps_avx(auVar9,auVar70);
  uVar50 = vmovmskps_avx(auVar9);
  if (uVar50 == 0) {
    return;
  }
  uVar50 = uVar50 & 0xff;
  auVar72._16_16_ = mm_lookupmask_ps._240_16_;
  auVar72._0_16_ = mm_lookupmask_ps._240_16_;
  local_288 = vblendps_avx(auVar72,ZEXT832(0) << 0x20,0x80);
  local_540 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_016d56b3:
  lVar55 = 0;
  uVar59 = (ulong)uVar50;
  for (uVar53 = uVar59; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar55 = lVar55 + 1;
  }
  uVar50 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar55 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar50].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar11 = *(undefined1 (*) [16])(_Var8 + uVar53 * (long)pvVar7);
  auVar9 = *(undefined1 (*) [16])(_Var8 + (uVar53 + 1) * (long)pvVar7);
  auVar70 = *(undefined1 (*) [16])(_Var8 + (uVar53 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar53 + 3));
  fVar60 = *pfVar1;
  fVar137 = pfVar1[1];
  fVar152 = pfVar1[2];
  fVar153 = pfVar1[3];
  lVar55 = *(long *)&pGVar5[1].time_range.upper;
  auVar276 = *(undefined1 (*) [16])(lVar55 + (long)p_Var6 * uVar53);
  auVar77 = *(undefined1 (*) [16])(lVar55 + (long)p_Var6 * (uVar53 + 1));
  auVar10 = *(undefined1 (*) [16])(lVar55 + (long)p_Var6 * (uVar53 + 2));
  uVar59 = uVar59 - 1 & uVar59;
  pfVar1 = (float *)(lVar55 + (long)p_Var6 * (uVar53 + 3));
  fVar154 = *pfVar1;
  fVar96 = pfVar1[1];
  fVar97 = pfVar1[2];
  fVar62 = pfVar1[3];
  if (uVar59 != 0) {
    uVar58 = uVar59 - 1 & uVar59;
    for (uVar53 = uVar59; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar58 != 0) {
      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar65._8_4_ = 0x80000000;
  auVar65._0_8_ = 0x8000000080000000;
  auVar65._12_4_ = 0x80000000;
  auVar121._0_4_ = fVar154 * -0.0;
  auVar121._4_4_ = fVar96 * -0.0;
  auVar121._8_4_ = fVar97 * -0.0;
  auVar121._12_4_ = fVar62 * -0.0;
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar10,auVar121);
  auVar76._0_4_ = auVar77._0_4_ + auVar63._0_4_;
  auVar76._4_4_ = auVar77._4_4_ + auVar63._4_4_;
  auVar76._8_4_ = auVar77._8_4_ + auVar63._8_4_;
  auVar76._12_4_ = auVar77._12_4_ + auVar63._12_4_;
  auVar98 = vfmadd231ps_fma(auVar76,auVar276,auVar65);
  auVar205 = ZEXT816(0) << 0x20;
  auVar99._0_4_ = fVar154 * 0.0;
  auVar99._4_4_ = fVar96 * 0.0;
  auVar99._8_4_ = fVar97 * 0.0;
  auVar99._12_4_ = fVar62 * 0.0;
  auVar200._8_4_ = 0x3f000000;
  auVar200._0_8_ = 0x3f0000003f000000;
  auVar200._12_4_ = 0x3f000000;
  auVar63 = vfmadd231ps_fma(auVar99,auVar10,auVar200);
  auVar63 = vfmadd231ps_fma(auVar63,auVar77,auVar205);
  auVar75 = vfnmadd231ps_fma(auVar63,auVar276,auVar200);
  auVar274._0_4_ = fVar60 * -0.0;
  auVar274._4_4_ = fVar137 * -0.0;
  auVar274._8_4_ = fVar152 * -0.0;
  auVar274._12_4_ = fVar153 * -0.0;
  auVar63 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar70,auVar274);
  auVar261._0_4_ = auVar63._0_4_ + auVar9._0_4_;
  auVar261._4_4_ = auVar63._4_4_ + auVar9._4_4_;
  auVar261._8_4_ = auVar63._8_4_ + auVar9._8_4_;
  auVar261._12_4_ = auVar63._12_4_ + auVar9._12_4_;
  auVar247._8_4_ = 0x80000000;
  auVar247._0_8_ = 0x8000000080000000;
  auVar247._12_4_ = 0x80000000;
  auVar63 = vfmadd231ps_fma(auVar261,auVar11,auVar247);
  auVar248._0_4_ = fVar60 * 0.0;
  auVar248._4_4_ = fVar137 * 0.0;
  auVar248._8_4_ = fVar152 * 0.0;
  auVar248._12_4_ = fVar153 * 0.0;
  auVar74 = vfmadd231ps_fma(auVar248,auVar70,auVar200);
  auVar74 = vfmadd231ps_fma(auVar74,auVar9,auVar205);
  auVar110 = vfnmadd231ps_fma(auVar74,auVar11,auVar200);
  auVar122._0_4_ = auVar10._0_4_ + auVar121._0_4_;
  auVar122._4_4_ = auVar10._4_4_ + auVar121._4_4_;
  auVar122._8_4_ = auVar10._8_4_ + auVar121._8_4_;
  auVar122._12_4_ = auVar10._12_4_ + auVar121._12_4_;
  auVar74 = vfmadd231ps_fma(auVar122,auVar77,auVar205);
  auVar123._8_4_ = 0x80000000;
  auVar123._0_8_ = 0x8000000080000000;
  auVar123._12_4_ = 0x80000000;
  auVar74 = vfmadd231ps_fma(auVar74,auVar276,auVar123);
  auVar124._0_4_ = fVar154 * 0.5;
  auVar124._4_4_ = fVar96 * 0.5;
  auVar124._8_4_ = fVar97 * 0.5;
  auVar124._12_4_ = fVar62 * 0.5;
  auVar66 = ZEXT816(0) << 0x20;
  auVar10 = vfmadd231ps_fma(auVar124,auVar66,auVar10);
  auVar77 = vfnmadd231ps_fma(auVar10,auVar200,auVar77);
  auVar205 = vfmadd231ps_fma(auVar77,auVar66,auVar276);
  auVar215._0_4_ = auVar274._0_4_ + auVar70._0_4_;
  auVar215._4_4_ = auVar274._4_4_ + auVar70._4_4_;
  auVar215._8_4_ = auVar274._8_4_ + auVar70._8_4_;
  auVar215._12_4_ = auVar274._12_4_ + auVar70._12_4_;
  auVar276 = vfmadd231ps_fma(auVar215,auVar9,auVar66);
  auVar77 = ZEXT816(0) << 0x20;
  auVar67._8_4_ = 0x80000000;
  auVar67._0_8_ = 0x8000000080000000;
  auVar67._12_4_ = 0x80000000;
  auVar10 = vfmadd231ps_fma(auVar276,auVar11,auVar67);
  auVar226._0_4_ = fVar60 * 0.5;
  auVar226._4_4_ = fVar137 * 0.5;
  auVar226._8_4_ = fVar152 * 0.5;
  auVar226._12_4_ = fVar153 * 0.5;
  auVar70 = vfmadd231ps_fma(auVar226,auVar77,auVar70);
  auVar9 = vfnmadd231ps_fma(auVar70,auVar200,auVar9);
  auVar11 = vfmadd231ps_fma(auVar9,auVar77,auVar11);
  auVar9 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar70 = vshufps_avx(auVar63,auVar63,0xc9);
  fVar154 = auVar75._0_4_;
  auVar160._0_4_ = fVar154 * auVar70._0_4_;
  fVar96 = auVar75._4_4_;
  auVar160._4_4_ = fVar96 * auVar70._4_4_;
  fVar97 = auVar75._8_4_;
  auVar160._8_4_ = fVar97 * auVar70._8_4_;
  fVar62 = auVar75._12_4_;
  auVar160._12_4_ = fVar62 * auVar70._12_4_;
  auVar70 = vfmsub231ps_fma(auVar160,auVar9,auVar63);
  auVar276 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar70 = vshufps_avx(auVar110,auVar110,0xc9);
  auVar161._0_4_ = fVar154 * auVar70._0_4_;
  auVar161._4_4_ = fVar96 * auVar70._4_4_;
  auVar161._8_4_ = fVar97 * auVar70._8_4_;
  auVar161._12_4_ = fVar62 * auVar70._12_4_;
  auVar9 = vfmsub231ps_fma(auVar161,auVar9,auVar110);
  auVar77 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar205,auVar205,0xc9);
  auVar70 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar178 = auVar205._0_4_;
  auVar141._0_4_ = fVar178 * auVar70._0_4_;
  fVar155 = auVar205._4_4_;
  auVar141._4_4_ = fVar155 * auVar70._4_4_;
  fVar156 = auVar205._8_4_;
  auVar141._8_4_ = fVar156 * auVar70._8_4_;
  fVar157 = auVar205._12_4_;
  auVar141._12_4_ = fVar157 * auVar70._12_4_;
  auVar70 = vfmsub231ps_fma(auVar141,auVar9,auVar10);
  auVar10 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar70 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar185._0_4_ = fVar178 * auVar70._0_4_;
  auVar185._4_4_ = fVar155 * auVar70._4_4_;
  auVar185._8_4_ = fVar156 * auVar70._8_4_;
  auVar185._12_4_ = fVar157 * auVar70._12_4_;
  auVar70 = vfmsub231ps_fma(auVar185,auVar9,auVar11);
  auVar9 = vdpps_avx(auVar276,auVar276,0x7f);
  auVar11 = vshufps_avx(auVar70,auVar70,0xc9);
  fVar137 = auVar9._0_4_;
  auVar95 = SUB1612(ZEXT816(0),0);
  auVar227._4_12_ = auVar95;
  auVar227._0_4_ = fVar137;
  auVar70 = vrsqrtss_avx(auVar227,auVar227);
  fVar60 = auVar70._0_4_;
  auVar70 = vdpps_avx(auVar276,auVar77,0x7f);
  fVar60 = fVar60 * 1.5 + fVar137 * -0.5 * fVar60 * fVar60 * fVar60;
  fVar158 = auVar276._0_4_ * fVar60;
  fVar177 = auVar276._4_4_ * fVar60;
  fVar179 = auVar276._8_4_ * fVar60;
  fVar180 = auVar276._12_4_ * fVar60;
  auVar239._0_4_ = auVar77._0_4_ * fVar137;
  auVar239._4_4_ = auVar77._4_4_ * fVar137;
  auVar239._8_4_ = auVar77._8_4_ * fVar137;
  auVar239._12_4_ = auVar77._12_4_ * fVar137;
  fVar137 = auVar70._0_4_;
  auVar201._0_4_ = auVar276._0_4_ * fVar137;
  auVar201._4_4_ = auVar276._4_4_ * fVar137;
  auVar201._8_4_ = auVar276._8_4_ * fVar137;
  auVar201._12_4_ = auVar276._12_4_ * fVar137;
  auVar276 = vsubps_avx(auVar239,auVar201);
  auVar70 = vrcpss_avx(auVar227,auVar227);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar70,SUB6416(ZEXT464(0x40000000),0));
  fVar152 = auVar70._0_4_ * auVar9._0_4_;
  auVar9 = vdpps_avx(auVar10,auVar10,0x7f);
  fVar153 = auVar9._0_4_;
  auVar216._4_12_ = auVar95;
  auVar216._0_4_ = fVar153;
  auVar70 = vrsqrtss_avx(auVar216,auVar216);
  fVar137 = auVar70._0_4_;
  fVar137 = fVar137 * 1.5 + fVar153 * -0.5 * fVar137 * fVar137 * fVar137;
  fVar246 = fVar137 * auVar10._0_4_;
  fVar258 = fVar137 * auVar10._4_4_;
  fVar259 = fVar137 * auVar10._8_4_;
  fVar260 = fVar137 * auVar10._12_4_;
  auVar70 = vdpps_avx(auVar10,auVar11,0x7f);
  auVar186._0_4_ = fVar153 * auVar11._0_4_;
  auVar186._4_4_ = fVar153 * auVar11._4_4_;
  auVar186._8_4_ = fVar153 * auVar11._8_4_;
  auVar186._12_4_ = fVar153 * auVar11._12_4_;
  fVar153 = auVar70._0_4_;
  auVar142._0_4_ = fVar153 * auVar10._0_4_;
  auVar142._4_4_ = fVar153 * auVar10._4_4_;
  auVar142._8_4_ = fVar153 * auVar10._8_4_;
  auVar142._12_4_ = fVar153 * auVar10._12_4_;
  auVar77 = vsubps_avx(auVar186,auVar142);
  auVar70 = vrcpss_avx(auVar216,auVar216);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar70,ZEXT416(0x40000000));
  fVar153 = auVar9._0_4_ * auVar70._0_4_;
  auVar9 = vshufps_avx(auVar98,auVar98,0xff);
  auVar217._0_4_ = auVar9._0_4_ * fVar158;
  auVar217._4_4_ = auVar9._4_4_ * fVar177;
  auVar217._8_4_ = auVar9._8_4_ * fVar179;
  auVar217._12_4_ = auVar9._12_4_ * fVar180;
  local_498 = vsubps_avx(auVar98,auVar217);
  auVar70 = vshufps_avx(auVar75,auVar75,0xff);
  auVar162._0_4_ = auVar70._0_4_ * fVar158 + fVar60 * auVar276._0_4_ * fVar152 * auVar9._0_4_;
  auVar162._4_4_ = auVar70._4_4_ * fVar177 + fVar60 * auVar276._4_4_ * fVar152 * auVar9._4_4_;
  auVar162._8_4_ = auVar70._8_4_ * fVar179 + fVar60 * auVar276._8_4_ * fVar152 * auVar9._8_4_;
  auVar162._12_4_ = auVar70._12_4_ * fVar180 + fVar60 * auVar276._12_4_ * fVar152 * auVar9._12_4_;
  auVar276 = vsubps_avx(auVar75,auVar162);
  local_4a8._0_4_ = auVar217._0_4_ + auVar98._0_4_;
  local_4a8._4_4_ = auVar217._4_4_ + auVar98._4_4_;
  fStack_4a0 = auVar217._8_4_ + auVar98._8_4_;
  fStack_49c = auVar217._12_4_ + auVar98._12_4_;
  auVar9 = vshufps_avx(auVar74,auVar74,0xff);
  auVar100._0_4_ = fVar246 * auVar9._0_4_;
  auVar100._4_4_ = fVar258 * auVar9._4_4_;
  auVar100._8_4_ = fVar259 * auVar9._8_4_;
  auVar100._12_4_ = fVar260 * auVar9._12_4_;
  local_4b8 = vsubps_avx(auVar74,auVar100);
  auVar70 = vshufps_avx(auVar205,auVar205,0xff);
  auVar78._0_4_ = fVar246 * auVar70._0_4_ + auVar9._0_4_ * fVar137 * auVar77._0_4_ * fVar153;
  auVar78._4_4_ = fVar258 * auVar70._4_4_ + auVar9._4_4_ * fVar137 * auVar77._4_4_ * fVar153;
  auVar78._8_4_ = fVar259 * auVar70._8_4_ + auVar9._8_4_ * fVar137 * auVar77._8_4_ * fVar153;
  auVar78._12_4_ = fVar260 * auVar70._12_4_ + auVar9._12_4_ * fVar137 * auVar77._12_4_ * fVar153;
  auVar9 = vsubps_avx(auVar205,auVar78);
  local_4c8._0_4_ = auVar74._0_4_ + auVar100._0_4_;
  local_4c8._4_4_ = auVar74._4_4_ + auVar100._4_4_;
  fStack_4c0 = auVar74._8_4_ + auVar100._8_4_;
  fStack_4bc = auVar74._12_4_ + auVar100._12_4_;
  local_4d8._0_4_ = local_498._0_4_ + auVar276._0_4_ * 0.33333334;
  local_4d8._4_4_ = local_498._4_4_ + auVar276._4_4_ * 0.33333334;
  local_4d8._8_4_ = local_498._8_4_ + auVar276._8_4_ * 0.33333334;
  local_4d8._12_4_ = local_498._12_4_ + auVar276._12_4_ * 0.33333334;
  auVar79._0_4_ = auVar9._0_4_ * 0.33333334;
  auVar79._4_4_ = auVar9._4_4_ * 0.33333334;
  auVar79._8_4_ = auVar9._8_4_ * 0.33333334;
  auVar79._12_4_ = auVar9._12_4_ * 0.33333334;
  local_4e8 = vsubps_avx(local_4b8,auVar79);
  local_478 = vsubps_avx(local_498,auVar64);
  auVar9 = vshufps_avx(local_478,local_478,0x55);
  auVar70 = vshufps_avx(local_478,local_478,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar60 = pre->ray_space[k].vz.field_0.m128[0];
  fVar137 = pre->ray_space[k].vz.field_0.m128[1];
  fVar152 = pre->ray_space[k].vz.field_0.m128[2];
  fVar153 = pre->ray_space[k].vz.field_0.m128[3];
  auVar80._0_4_ = fVar60 * auVar70._0_4_;
  auVar80._4_4_ = fVar137 * auVar70._4_4_;
  auVar80._8_4_ = fVar152 * auVar70._8_4_;
  auVar80._12_4_ = fVar153 * auVar70._12_4_;
  auVar276 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar2,auVar9);
  local_488 = vsubps_avx(local_4d8,auVar64);
  auVar9 = vshufps_avx(local_488,local_488,0x55);
  auVar70 = vshufps_avx(local_488,local_488,0xaa);
  auVar81._0_4_ = fVar60 * auVar70._0_4_;
  auVar81._4_4_ = fVar137 * auVar70._4_4_;
  auVar81._8_4_ = fVar152 * auVar70._8_4_;
  auVar81._12_4_ = fVar153 * auVar70._12_4_;
  auVar70 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar2,auVar9);
  local_2f8 = vsubps_avx(local_4e8,auVar64);
  auVar9 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar249._0_4_ = fVar60 * auVar9._0_4_;
  auVar249._4_4_ = fVar137 * auVar9._4_4_;
  auVar249._8_4_ = fVar152 * auVar9._8_4_;
  auVar249._12_4_ = fVar153 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar77 = vfmadd231ps_fma(auVar249,(undefined1  [16])aVar2,auVar9);
  local_308 = vsubps_avx(local_4b8,auVar64);
  auVar9 = vshufps_avx(local_308,local_308,0xaa);
  auVar82._0_4_ = fVar60 * auVar9._0_4_;
  auVar82._4_4_ = fVar137 * auVar9._4_4_;
  auVar82._8_4_ = fVar152 * auVar9._8_4_;
  auVar82._12_4_ = fVar153 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_308,local_308,0x55);
  auVar10 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar2,auVar9);
  local_318 = vsubps_avx(_local_4a8,auVar64);
  auVar9 = vshufps_avx(local_318,local_318,0xaa);
  auVar143._0_4_ = fVar60 * auVar9._0_4_;
  auVar143._4_4_ = fVar137 * auVar9._4_4_;
  auVar143._8_4_ = fVar152 * auVar9._8_4_;
  auVar143._12_4_ = fVar153 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_318,local_318,0x55);
  auVar11 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar2,auVar9);
  local_4f8._0_4_ = (fVar154 + auVar162._0_4_) * 0.33333334 + (float)local_4a8._0_4_;
  local_4f8._4_4_ = (fVar96 + auVar162._4_4_) * 0.33333334 + (float)local_4a8._4_4_;
  fStack_4f0 = (fVar97 + auVar162._8_4_) * 0.33333334 + fStack_4a0;
  fStack_4ec = (fVar62 + auVar162._12_4_) * 0.33333334 + fStack_49c;
  local_328 = vsubps_avx(_local_4f8,auVar64);
  auVar9 = vshufps_avx(local_328,local_328,0xaa);
  auVar202._0_4_ = auVar9._0_4_ * fVar60;
  auVar202._4_4_ = auVar9._4_4_ * fVar137;
  auVar202._8_4_ = auVar9._8_4_ * fVar152;
  auVar202._12_4_ = auVar9._12_4_ * fVar153;
  auVar9 = vshufps_avx(local_328,local_328,0x55);
  auVar63 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar2,auVar9);
  auVar218._0_4_ = (fVar178 + auVar78._0_4_) * 0.33333334;
  auVar218._4_4_ = (fVar155 + auVar78._4_4_) * 0.33333334;
  auVar218._8_4_ = (fVar156 + auVar78._8_4_) * 0.33333334;
  auVar218._12_4_ = (fVar157 + auVar78._12_4_) * 0.33333334;
  _local_508 = vsubps_avx(_local_4c8,auVar218);
  local_338 = vsubps_avx(_local_508,auVar64);
  auVar9 = vshufps_avx(local_338,local_338,0xaa);
  auVar219._0_4_ = auVar9._0_4_ * fVar60;
  auVar219._4_4_ = auVar9._4_4_ * fVar137;
  auVar219._8_4_ = auVar9._8_4_ * fVar152;
  auVar219._12_4_ = auVar9._12_4_ * fVar153;
  auVar9 = vshufps_avx(local_338,local_338,0x55);
  auVar98 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar2,auVar9);
  local_348 = vsubps_avx(_local_4c8,auVar64);
  auVar9 = vshufps_avx(local_348,local_348,0xaa);
  auVar83._0_4_ = fVar60 * auVar9._0_4_;
  auVar83._4_4_ = fVar137 * auVar9._4_4_;
  auVar83._8_4_ = fVar152 * auVar9._8_4_;
  auVar83._12_4_ = fVar153 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_348,local_348,0x55);
  auVar9 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar2,auVar9);
  auVar163._4_4_ = local_478._0_4_;
  auVar163._0_4_ = local_478._0_4_;
  auVar163._8_4_ = local_478._0_4_;
  auVar163._12_4_ = local_478._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar64 = vfmadd231ps_fma(auVar276,(undefined1  [16])aVar2,auVar163);
  auVar164._4_4_ = local_488._0_4_;
  auVar164._0_4_ = local_488._0_4_;
  auVar164._8_4_ = local_488._0_4_;
  auVar164._12_4_ = local_488._0_4_;
  auVar74 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar2,auVar164);
  uVar61 = local_2f8._0_4_;
  auVar165._4_4_ = uVar61;
  auVar165._0_4_ = uVar61;
  auVar165._8_4_ = uVar61;
  auVar165._12_4_ = uVar61;
  auVar205 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar2,auVar165);
  uVar61 = local_308._0_4_;
  auVar166._4_4_ = uVar61;
  auVar166._0_4_ = uVar61;
  auVar166._8_4_ = uVar61;
  auVar166._12_4_ = uVar61;
  auVar75 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar166);
  uVar61 = local_318._0_4_;
  auVar167._4_4_ = uVar61;
  auVar167._0_4_ = uVar61;
  auVar167._8_4_ = uVar61;
  auVar167._12_4_ = uVar61;
  auVar110 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar167);
  uVar61 = local_328._0_4_;
  auVar168._4_4_ = uVar61;
  auVar168._0_4_ = uVar61;
  auVar168._8_4_ = uVar61;
  auVar168._12_4_ = uVar61;
  auVar63 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar168);
  uVar61 = local_338._0_4_;
  auVar169._4_4_ = uVar61;
  auVar169._0_4_ = uVar61;
  auVar169._8_4_ = uVar61;
  auVar169._12_4_ = uVar61;
  auVar98 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar2,auVar169);
  uVar61 = local_348._0_4_;
  auVar170._4_4_ = uVar61;
  auVar170._0_4_ = uVar61;
  auVar170._8_4_ = uVar61;
  auVar170._12_4_ = uVar61;
  auVar66 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar170);
  auVar77 = vmovlhps_avx(auVar64,auVar110);
  auVar10 = vmovlhps_avx(auVar74,auVar63);
  auVar11 = vmovlhps_avx(auVar205,auVar98);
  _local_468 = vmovlhps_avx(auVar75,auVar66);
  auVar9 = vminps_avx(auVar77,auVar10);
  auVar70 = vminps_avx(auVar11,_local_468);
  auVar276 = vminps_avx(auVar9,auVar70);
  auVar9 = vmaxps_avx(auVar77,auVar10);
  auVar70 = vmaxps_avx(auVar11,_local_468);
  auVar9 = vmaxps_avx(auVar9,auVar70);
  auVar70 = vshufpd_avx(auVar276,auVar276,3);
  auVar276 = vminps_avx(auVar276,auVar70);
  auVar70 = vshufpd_avx(auVar9,auVar9,3);
  auVar70 = vmaxps_avx(auVar9,auVar70);
  auVar9 = vandps_avx(auVar281,auVar276);
  auVar70 = vandps_avx(auVar281,auVar70);
  auVar9 = vmaxps_avx(auVar9,auVar70);
  auVar70 = vmovshdup_avx(auVar9);
  auVar9 = vmaxss_avx(auVar70,auVar9);
  local_198 = auVar9._0_4_ * 9.536743e-07;
  local_3e8._8_8_ = auVar64._0_8_;
  local_3e8._0_8_ = auVar64._0_8_;
  local_3f8._8_8_ = auVar74._0_8_;
  local_3f8._0_8_ = auVar74._0_8_;
  local_408._0_8_ = auVar205._0_8_;
  local_408._8_8_ = local_408._0_8_;
  local_668._0_8_ = auVar75._0_8_;
  local_418._8_8_ = local_668._0_8_;
  local_418._0_8_ = local_668._0_8_;
  local_428 = auVar110._0_8_;
  register0x00001348 = local_428;
  register0x000013c8 = auVar63._0_8_;
  local_438 = auVar63._0_8_;
  register0x00001408 = auVar98._0_8_;
  local_448 = auVar98._0_8_;
  register0x00001448 = auVar66._0_8_;
  local_458 = auVar66._0_8_;
  local_2e8 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  fStack_1b0 = -local_198;
  local_1b8 = -local_198;
  fStack_1b4 = -local_198;
  fStack_1ac = fStack_1b0;
  fStack_1a8 = fStack_1b0;
  fStack_1a4 = fStack_1b0;
  fStack_1a0 = fStack_1b0;
  fStack_19c = fStack_1b0;
  local_3b8 = uVar50;
  uStack_3b4 = uVar50;
  uStack_3b0 = uVar50;
  uStack_3ac = uVar50;
  local_3c8 = uVar4;
  uStack_3c4 = uVar4;
  uStack_3c0 = uVar4;
  uStack_3bc = uVar4;
  uVar53 = 0;
  fVar60 = *(float *)(ray + k * 4 + 0x30);
  local_2b8 = vsubps_avx(auVar10,auVar77);
  local_2c8 = vsubps_avx(auVar11,auVar10);
  local_2d8 = vsubps_avx(_local_468,auVar11);
  local_368 = vsubps_avx(_local_4a8,local_498);
  local_378 = vsubps_avx(_local_4f8,local_4d8);
  local_388 = vsubps_avx(_local_508,local_4e8);
  _local_398 = vsubps_avx(_local_4c8,local_4b8);
  local_668 = ZEXT816(0x3f80000000000000);
  local_358 = local_668;
  do {
    auVar9 = vshufps_avx(local_668,local_668,0x50);
    auVar111._8_4_ = 0x3f800000;
    auVar111._0_8_ = &DAT_3f8000003f800000;
    auVar111._12_4_ = 0x3f800000;
    auVar117._16_4_ = 0x3f800000;
    auVar117._0_16_ = auVar111;
    auVar117._20_4_ = 0x3f800000;
    auVar117._24_4_ = 0x3f800000;
    auVar117._28_4_ = 0x3f800000;
    auVar70 = vsubps_avx(auVar111,auVar9);
    fVar137 = auVar9._0_4_;
    auVar68._0_4_ = local_428._0_4_ * fVar137;
    fVar152 = auVar9._4_4_;
    auVar68._4_4_ = local_428._4_4_ * fVar152;
    fVar153 = auVar9._8_4_;
    auVar68._8_4_ = local_428._8_4_ * fVar153;
    fVar154 = auVar9._12_4_;
    auVar68._12_4_ = local_428._12_4_ * fVar154;
    auVar144._0_4_ = local_438._0_4_ * fVar137;
    auVar144._4_4_ = local_438._4_4_ * fVar152;
    auVar144._8_4_ = local_438._8_4_ * fVar153;
    auVar144._12_4_ = local_438._12_4_ * fVar154;
    auVar187._0_4_ = local_448._0_4_ * fVar137;
    auVar187._4_4_ = local_448._4_4_ * fVar152;
    auVar187._8_4_ = local_448._8_4_ * fVar153;
    auVar187._12_4_ = local_448._12_4_ * fVar154;
    auVar275._0_4_ = local_458._0_4_ * fVar137;
    auVar275._4_4_ = local_458._4_4_ * fVar152;
    auVar275._8_4_ = local_458._8_4_ * fVar153;
    auVar275._12_4_ = local_458._12_4_ * fVar154;
    auVar63 = vfmadd231ps_fma(auVar68,auVar70,local_3e8);
    auVar98 = vfmadd231ps_fma(auVar144,auVar70,local_3f8);
    auVar74 = vfmadd231ps_fma(auVar187,auVar70,local_408);
    auVar205 = vfmadd231ps_fma(auVar275,local_418,auVar70);
    local_608 = auVar205._0_4_;
    auVar9 = vmovshdup_avx(local_358);
    fVar137 = local_358._0_4_;
    fVar96 = (auVar9._0_4_ - fVar137) * 0.04761905;
    auVar213._4_4_ = fVar137;
    auVar213._0_4_ = fVar137;
    auVar213._8_4_ = fVar137;
    auVar213._12_4_ = fVar137;
    auVar213._16_4_ = fVar137;
    auVar213._20_4_ = fVar137;
    auVar213._24_4_ = fVar137;
    auVar213._28_4_ = fVar137;
    auVar107._0_8_ = auVar9._0_8_;
    auVar107._8_8_ = auVar107._0_8_;
    auVar107._16_8_ = auVar107._0_8_;
    auVar107._24_8_ = auVar107._0_8_;
    auVar72 = vsubps_avx(auVar107,auVar213);
    uVar61 = auVar63._0_4_;
    auVar285._4_4_ = uVar61;
    auVar285._0_4_ = uVar61;
    auVar285._8_4_ = uVar61;
    auVar285._12_4_ = uVar61;
    auVar285._16_4_ = uVar61;
    auVar285._20_4_ = uVar61;
    auVar285._24_4_ = uVar61;
    auVar285._28_4_ = uVar61;
    auVar9 = vmovshdup_avx(auVar63);
    uVar159 = auVar9._0_8_;
    auVar270._8_8_ = uVar159;
    auVar270._0_8_ = uVar159;
    auVar270._16_8_ = uVar159;
    auVar270._24_8_ = uVar159;
    fVar97 = auVar98._0_4_;
    auVar92._4_4_ = fVar97;
    auVar92._0_4_ = fVar97;
    auVar92._8_4_ = fVar97;
    auVar92._12_4_ = fVar97;
    auVar92._16_4_ = fVar97;
    auVar92._20_4_ = fVar97;
    auVar92._24_4_ = fVar97;
    auVar92._28_4_ = fVar97;
    auVar70 = vmovshdup_avx(auVar98);
    auVar174._0_8_ = auVar70._0_8_;
    auVar174._8_8_ = auVar174._0_8_;
    auVar174._16_8_ = auVar174._0_8_;
    auVar174._24_8_ = auVar174._0_8_;
    fVar155 = auVar74._0_4_;
    auVar245._4_4_ = fVar155;
    auVar245._0_4_ = fVar155;
    auVar245._8_4_ = fVar155;
    auVar245._12_4_ = fVar155;
    auVar245._16_4_ = fVar155;
    auVar245._20_4_ = fVar155;
    auVar245._24_4_ = fVar155;
    auVar245._28_4_ = fVar155;
    auVar276 = vmovshdup_avx(auVar74);
    auVar224._0_8_ = auVar276._0_8_;
    auVar224._8_8_ = auVar224._0_8_;
    auVar224._16_8_ = auVar224._0_8_;
    auVar224._24_8_ = auVar224._0_8_;
    auVar64 = vmovshdup_avx(auVar205);
    auVar75 = vfmadd132ps_fma(auVar72,auVar213,_DAT_02020f20);
    auVar72 = vsubps_avx(auVar117,ZEXT1632(auVar75));
    fVar137 = auVar75._0_4_;
    auVar278._0_4_ = fVar97 * fVar137;
    fVar152 = auVar75._4_4_;
    auVar278._4_4_ = fVar97 * fVar152;
    fVar153 = auVar75._8_4_;
    auVar278._8_4_ = fVar97 * fVar153;
    fVar154 = auVar75._12_4_;
    auVar278._12_4_ = fVar97 * fVar154;
    auVar278._16_4_ = fVar97 * 0.0;
    auVar278._20_4_ = fVar97 * 0.0;
    auVar278._24_4_ = fVar97 * 0.0;
    auVar278._28_4_ = 0;
    auVar75 = vfmadd231ps_fma(auVar278,auVar72,auVar285);
    fVar62 = auVar70._0_4_;
    auVar255._0_4_ = fVar62 * fVar137;
    fVar178 = auVar70._4_4_;
    auVar255._4_4_ = fVar178 * fVar152;
    auVar255._8_4_ = fVar62 * fVar153;
    auVar255._12_4_ = fVar178 * fVar154;
    auVar255._16_4_ = fVar62 * 0.0;
    auVar255._20_4_ = fVar178 * 0.0;
    auVar255._24_4_ = fVar62 * 0.0;
    auVar255._28_4_ = 0;
    auVar110 = vfmadd231ps_fma(auVar255,auVar72,auVar270);
    auVar12._4_4_ = fVar155 * fVar152;
    auVar12._0_4_ = fVar155 * fVar137;
    auVar12._8_4_ = fVar155 * fVar153;
    auVar12._12_4_ = fVar155 * fVar154;
    auVar12._16_4_ = fVar155 * 0.0;
    auVar12._20_4_ = fVar155 * 0.0;
    auVar12._24_4_ = fVar155 * 0.0;
    auVar12._28_4_ = auVar9._4_4_;
    auVar66 = vfmadd231ps_fma(auVar12,auVar72,auVar92);
    fVar62 = auVar276._0_4_;
    fVar178 = auVar276._4_4_;
    auVar13._4_4_ = fVar178 * fVar152;
    auVar13._0_4_ = fVar62 * fVar137;
    auVar13._8_4_ = fVar62 * fVar153;
    auVar13._12_4_ = fVar178 * fVar154;
    auVar13._16_4_ = fVar62 * 0.0;
    auVar13._20_4_ = fVar178 * 0.0;
    auVar13._24_4_ = fVar62 * 0.0;
    auVar13._28_4_ = uVar61;
    auVar127 = vfmadd231ps_fma(auVar13,auVar72,auVar174);
    auVar9 = vshufps_avx(auVar63,auVar63,0xaa);
    auVar175._0_8_ = auVar9._0_8_;
    auVar175._8_8_ = auVar175._0_8_;
    auVar175._16_8_ = auVar175._0_8_;
    auVar175._24_8_ = auVar175._0_8_;
    auVar70 = vshufps_avx(auVar63,auVar63,0xff);
    uStack_5a0 = auVar70._0_8_;
    local_5a8 = (undefined1  [8])uStack_5a0;
    uStack_598 = uStack_5a0;
    uStack_590 = uStack_5a0;
    auVar14._4_4_ = fVar152 * local_608;
    auVar14._0_4_ = fVar137 * local_608;
    auVar14._8_4_ = fVar153 * local_608;
    auVar14._12_4_ = fVar154 * local_608;
    auVar14._16_4_ = local_608 * 0.0;
    auVar14._20_4_ = local_608 * 0.0;
    auVar14._24_4_ = local_608 * 0.0;
    auVar14._28_4_ = 0x3f800000;
    auVar73 = vfmadd231ps_fma(auVar14,auVar72,auVar245);
    auVar276 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar135._0_8_ = auVar276._0_8_;
    auVar135._8_8_ = auVar135._0_8_;
    auVar135._16_8_ = auVar135._0_8_;
    auVar135._24_8_ = auVar135._0_8_;
    auVar63 = vshufps_avx(auVar98,auVar98,0xff);
    auVar151._0_8_ = auVar63._0_8_;
    auVar151._8_8_ = auVar151._0_8_;
    auVar151._16_8_ = auVar151._0_8_;
    auVar151._24_8_ = auVar151._0_8_;
    fVar62 = auVar64._0_4_;
    fVar178 = auVar64._4_4_;
    auVar15._4_4_ = fVar178 * fVar152;
    auVar15._0_4_ = fVar62 * fVar137;
    auVar15._8_4_ = fVar62 * fVar153;
    auVar15._12_4_ = fVar178 * fVar154;
    auVar15._16_4_ = fVar62 * 0.0;
    auVar15._20_4_ = fVar178 * 0.0;
    auVar15._24_4_ = fVar62 * 0.0;
    auVar15._28_4_ = fVar155;
    auVar120 = vfmadd231ps_fma(auVar15,auVar72,auVar224);
    auVar16._28_4_ = fVar97;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar66._12_4_ * fVar154,
                            CONCAT48(auVar66._8_4_ * fVar153,
                                     CONCAT44(auVar66._4_4_ * fVar152,auVar66._0_4_ * fVar137))));
    auVar75 = vfmadd231ps_fma(auVar16,auVar72,ZEXT1632(auVar75));
    auVar17._28_4_ = auVar70._4_4_;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar127._12_4_ * fVar154,
                            CONCAT48(auVar127._8_4_ * fVar153,
                                     CONCAT44(auVar127._4_4_ * fVar152,auVar127._0_4_ * fVar137))));
    auVar110 = vfmadd231ps_fma(auVar17,auVar72,ZEXT1632(auVar110));
    auVar70 = vshufps_avx(auVar74,auVar74,0xaa);
    uVar159 = auVar70._0_8_;
    auVar256._8_8_ = uVar159;
    auVar256._0_8_ = uVar159;
    auVar256._16_8_ = uVar159;
    auVar256._24_8_ = uVar159;
    auVar64 = vshufps_avx(auVar74,auVar74,0xff);
    uVar159 = auVar64._0_8_;
    auVar279._8_8_ = uVar159;
    auVar279._0_8_ = uVar159;
    auVar279._16_8_ = uVar159;
    auVar279._24_8_ = uVar159;
    auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar154 * auVar73._12_4_,
                                                 CONCAT48(fVar153 * auVar73._8_4_,
                                                          CONCAT44(fVar152 * auVar73._4_4_,
                                                                   fVar137 * auVar73._0_4_)))),
                              auVar72,ZEXT1632(auVar66));
    auVar98 = vshufps_avx(auVar205,auVar205,0xaa);
    auVar74 = vshufps_avx(auVar205,auVar205,0xff);
    local_608 = auVar74._0_4_;
    fStack_604 = auVar74._4_4_;
    auVar18._28_4_ = fStack_604;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar120._12_4_ * fVar154,
                            CONCAT48(auVar120._8_4_ * fVar153,
                                     CONCAT44(auVar120._4_4_ * fVar152,auVar120._0_4_ * fVar137))));
    auVar74 = vfmadd231ps_fma(auVar18,auVar72,ZEXT1632(auVar127));
    auVar205 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar154 * auVar66._12_4_,
                                                  CONCAT48(fVar153 * auVar66._8_4_,
                                                           CONCAT44(fVar152 * auVar66._4_4_,
                                                                    fVar137 * auVar66._0_4_)))),
                               auVar72,ZEXT1632(auVar75));
    auVar12 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar75));
    auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar154 * auVar74._12_4_,
                                                 CONCAT48(fVar153 * auVar74._8_4_,
                                                          CONCAT44(fVar152 * auVar74._4_4_,
                                                                   fVar137 * auVar74._0_4_)))),
                              auVar72,ZEXT1632(auVar110));
    auVar13 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar110));
    fVar158 = fVar96 * auVar12._0_4_ * 3.0;
    fVar179 = fVar96 * auVar12._4_4_ * 3.0;
    auVar257._4_4_ = fVar179;
    auVar257._0_4_ = fVar158;
    fVar246 = fVar96 * auVar12._8_4_ * 3.0;
    auVar257._8_4_ = fVar246;
    fVar259 = fVar96 * auVar12._12_4_ * 3.0;
    auVar257._12_4_ = fVar259;
    fVar235 = fVar96 * auVar12._16_4_ * 3.0;
    auVar257._16_4_ = fVar235;
    fVar236 = fVar96 * auVar12._20_4_ * 3.0;
    auVar257._20_4_ = fVar236;
    fVar237 = fVar96 * auVar12._24_4_ * 3.0;
    auVar257._24_4_ = fVar237;
    auVar257._28_4_ = 0x40400000;
    local_588._0_4_ = fVar96 * auVar13._0_4_ * 3.0;
    local_588._4_4_ = fVar96 * auVar13._4_4_ * 3.0;
    fStack_580 = fVar96 * auVar13._8_4_ * 3.0;
    fStack_57c = fVar96 * auVar13._12_4_ * 3.0;
    fStack_578 = fVar96 * auVar13._16_4_ * 3.0;
    fStack_574 = fVar96 * auVar13._20_4_ * 3.0;
    fStack_570 = fVar96 * auVar13._24_4_ * 3.0;
    fStack_56c = auVar13._28_4_;
    fVar97 = auVar276._0_4_;
    fVar62 = auVar276._4_4_;
    auVar20._4_4_ = fVar62 * fVar152;
    auVar20._0_4_ = fVar97 * fVar137;
    auVar20._8_4_ = fVar97 * fVar153;
    auVar20._12_4_ = fVar62 * fVar154;
    auVar20._16_4_ = fVar97 * 0.0;
    auVar20._20_4_ = fVar62 * 0.0;
    auVar20._24_4_ = fVar97 * 0.0;
    auVar20._28_4_ = auVar12._28_4_;
    auVar276 = vfmadd231ps_fma(auVar20,auVar72,auVar175);
    fVar97 = auVar63._0_4_;
    fVar178 = auVar63._4_4_;
    auVar21._4_4_ = fVar178 * fVar152;
    auVar21._0_4_ = fVar97 * fVar137;
    auVar21._8_4_ = fVar97 * fVar153;
    auVar21._12_4_ = fVar178 * fVar154;
    auVar21._16_4_ = fVar97 * 0.0;
    auVar21._20_4_ = fVar178 * 0.0;
    auVar21._24_4_ = fVar97 * 0.0;
    auVar21._28_4_ = auVar9._4_4_;
    auVar9 = vfmadd231ps_fma(auVar21,auVar72,_local_5a8);
    fVar97 = auVar70._0_4_;
    fVar178 = auVar70._4_4_;
    auVar22._4_4_ = fVar178 * fVar152;
    auVar22._0_4_ = fVar97 * fVar137;
    auVar22._8_4_ = fVar97 * fVar153;
    auVar22._12_4_ = fVar178 * fVar154;
    auVar22._16_4_ = fVar97 * 0.0;
    auVar22._20_4_ = fVar178 * 0.0;
    auVar22._24_4_ = fVar97 * 0.0;
    auVar22._28_4_ = fVar96;
    auVar70 = vfmadd231ps_fma(auVar22,auVar72,auVar135);
    fVar97 = auVar64._0_4_;
    fVar155 = auVar64._4_4_;
    auVar23._4_4_ = fVar155 * fVar152;
    auVar23._0_4_ = fVar97 * fVar137;
    auVar23._8_4_ = fVar97 * fVar153;
    auVar23._12_4_ = fVar155 * fVar154;
    auVar23._16_4_ = fVar97 * 0.0;
    auVar23._20_4_ = fVar155 * 0.0;
    auVar23._24_4_ = fVar97 * 0.0;
    auVar23._28_4_ = fVar62;
    auVar64 = vfmadd231ps_fma(auVar23,auVar72,auVar151);
    local_2a8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar205));
    fVar97 = auVar98._0_4_;
    fVar62 = auVar98._4_4_;
    auVar24._4_4_ = fVar62 * fVar152;
    auVar24._0_4_ = fVar97 * fVar137;
    auVar24._8_4_ = fVar97 * fVar153;
    auVar24._12_4_ = fVar62 * fVar154;
    auVar24._16_4_ = fVar97 * 0.0;
    auVar24._20_4_ = fVar62 * 0.0;
    auVar24._24_4_ = fVar97 * 0.0;
    auVar24._28_4_ = local_2a8._28_4_;
    auVar63 = vfmadd231ps_fma(auVar24,auVar72,auVar256);
    auVar16 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar75));
    auVar25._4_4_ = fVar152 * fStack_604;
    auVar25._0_4_ = fVar137 * local_608;
    auVar25._8_4_ = fVar153 * local_608;
    auVar25._12_4_ = fVar154 * fStack_604;
    auVar25._16_4_ = local_608 * 0.0;
    auVar25._20_4_ = fStack_604 * 0.0;
    auVar25._24_4_ = local_608 * 0.0;
    auVar25._28_4_ = fVar178;
    auVar98 = vfmadd231ps_fma(auVar25,auVar72,auVar279);
    auVar26._28_4_ = fVar62;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar154 * auVar70._12_4_,
                            CONCAT48(fVar153 * auVar70._8_4_,
                                     CONCAT44(fVar152 * auVar70._4_4_,fVar137 * auVar70._0_4_))));
    auVar276 = vfmadd231ps_fma(auVar26,auVar72,ZEXT1632(auVar276));
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar154 * auVar64._12_4_,
                                                CONCAT48(fVar153 * auVar64._8_4_,
                                                         CONCAT44(fVar152 * auVar64._4_4_,
                                                                  fVar137 * auVar64._0_4_)))),
                             auVar72,ZEXT1632(auVar9));
    fVar158 = auVar205._0_4_ + fVar158;
    fVar179 = auVar205._4_4_ + fVar179;
    fVar246 = auVar205._8_4_ + fVar246;
    fVar259 = auVar205._12_4_ + fVar259;
    fVar235 = fVar235 + 0.0;
    fVar236 = fVar236 + 0.0;
    fVar237 = fVar237 + 0.0;
    auVar27._28_4_ = 0x40400000;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar98._12_4_ * fVar154,
                            CONCAT48(auVar98._8_4_ * fVar153,
                                     CONCAT44(auVar98._4_4_ * fVar152,auVar98._0_4_ * fVar137))));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar154 * auVar63._12_4_,
                                                 CONCAT48(fVar153 * auVar63._8_4_,
                                                          CONCAT44(fVar152 * auVar63._4_4_,
                                                                   fVar137 * auVar63._0_4_)))),
                              auVar72,ZEXT1632(auVar70));
    auVar64 = vfmadd231ps_fma(auVar27,auVar72,ZEXT1632(auVar64));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar154 * auVar70._12_4_,
                                                 CONCAT48(fVar153 * auVar70._8_4_,
                                                          CONCAT44(fVar152 * auVar70._4_4_,
                                                                   fVar137 * auVar70._0_4_)))),
                              auVar72,ZEXT1632(auVar276));
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar154 * auVar64._12_4_,
                                                 CONCAT48(fVar153 * auVar64._8_4_,
                                                          CONCAT44(fVar152 * auVar64._4_4_,
                                                                   fVar137 * auVar64._0_4_)))),
                              ZEXT1632(auVar9),auVar72);
    auVar72 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar276));
    auVar12 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar9));
    fVar137 = fVar96 * auVar72._0_4_ * 3.0;
    fVar152 = fVar96 * auVar72._4_4_ * 3.0;
    auVar28._4_4_ = fVar152;
    auVar28._0_4_ = fVar137;
    fVar153 = fVar96 * auVar72._8_4_ * 3.0;
    auVar28._8_4_ = fVar153;
    fVar154 = fVar96 * auVar72._12_4_ * 3.0;
    auVar28._12_4_ = fVar154;
    fVar155 = fVar96 * auVar72._16_4_ * 3.0;
    auVar28._16_4_ = fVar155;
    fVar156 = fVar96 * auVar72._20_4_ * 3.0;
    auVar28._20_4_ = fVar156;
    fVar157 = fVar96 * auVar72._24_4_ * 3.0;
    auVar28._24_4_ = fVar157;
    auVar28._28_4_ = 0x40400000;
    auVar197._0_4_ = fVar96 * auVar12._0_4_ * 3.0;
    auVar197._4_4_ = fVar96 * auVar12._4_4_ * 3.0;
    auVar197._8_4_ = fVar96 * auVar12._8_4_ * 3.0;
    auVar197._12_4_ = fVar96 * auVar12._12_4_ * 3.0;
    auVar197._16_4_ = fVar96 * auVar12._16_4_ * 3.0;
    auVar197._20_4_ = fVar96 * auVar12._20_4_ * 3.0;
    auVar197._24_4_ = fVar96 * auVar12._24_4_ * 3.0;
    auVar197._28_4_ = 0;
    auVar17 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar63));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar98));
    auVar72 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar205));
    auVar12 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar75));
    auVar14 = vsubps_avx(auVar17,local_2a8);
    fVar177 = auVar72._0_4_ + auVar14._0_4_;
    fVar180 = auVar72._4_4_ + auVar14._4_4_;
    fVar258 = auVar72._8_4_ + auVar14._8_4_;
    fVar260 = auVar72._12_4_ + auVar14._12_4_;
    fVar181 = auVar72._16_4_ + auVar14._16_4_;
    fVar182 = auVar72._20_4_ + auVar14._20_4_;
    fVar183 = auVar72._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(local_78,auVar16);
    auVar271._0_4_ = auVar12._0_4_ + auVar15._0_4_;
    auVar271._4_4_ = auVar12._4_4_ + auVar15._4_4_;
    auVar271._8_4_ = auVar12._8_4_ + auVar15._8_4_;
    auVar271._12_4_ = auVar12._12_4_ + auVar15._12_4_;
    auVar271._16_4_ = auVar12._16_4_ + auVar15._16_4_;
    auVar271._20_4_ = auVar12._20_4_ + auVar15._20_4_;
    auVar271._24_4_ = auVar12._24_4_ + auVar15._24_4_;
    auVar271._28_4_ = auVar12._28_4_ + auVar15._28_4_;
    fVar96 = auVar75._0_4_;
    local_158 = fVar96 + (float)local_588._0_4_;
    fVar97 = auVar75._4_4_;
    fStack_154 = fVar97 + (float)local_588._4_4_;
    fVar62 = auVar75._8_4_;
    fStack_150 = fVar62 + fStack_580;
    fVar178 = auVar75._12_4_;
    fStack_14c = fVar178 + fStack_57c;
    fStack_148 = fStack_578 + 0.0;
    fStack_144 = fStack_574 + 0.0;
    fStack_140 = fStack_570 + 0.0;
    fStack_13c = auVar13._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar205);
    auVar12 = vsubps_avx(local_98,auVar257);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    local_b8 = ZEXT1632(auVar75);
    auVar12 = vsubps_avx(local_b8,_local_588);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    local_f8._0_4_ = auVar63._0_4_ + fVar137;
    local_f8._4_4_ = auVar63._4_4_ + fVar152;
    local_f8._8_4_ = auVar63._8_4_ + fVar153;
    local_f8._12_4_ = auVar63._12_4_ + fVar154;
    local_f8._16_4_ = fVar155 + 0.0;
    local_f8._20_4_ = fVar156 + 0.0;
    local_f8._24_4_ = fVar157 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar257 = ZEXT1632(auVar63);
    auVar12 = vsubps_avx(auVar257,auVar28);
    auVar18 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    fVar137 = auVar98._0_4_;
    local_138._0_4_ = fVar137 + auVar197._0_4_;
    fVar152 = auVar98._4_4_;
    local_138._4_4_ = fVar152 + auVar197._4_4_;
    fVar153 = auVar98._8_4_;
    local_138._8_4_ = fVar153 + auVar197._8_4_;
    fVar154 = auVar98._12_4_;
    local_138._12_4_ = fVar154 + auVar197._12_4_;
    local_138._16_4_ = auVar197._16_4_ + 0.0;
    local_138._20_4_ = auVar197._20_4_ + 0.0;
    local_138._24_4_ = auVar197._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar12 = vsubps_avx(ZEXT1632(auVar98),auVar197);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    auVar29._4_4_ = fVar97 * fVar180;
    auVar29._0_4_ = fVar96 * fVar177;
    auVar29._8_4_ = fVar62 * fVar258;
    auVar29._12_4_ = fVar178 * fVar260;
    auVar29._16_4_ = fVar181 * 0.0;
    auVar29._20_4_ = fVar182 * 0.0;
    auVar29._24_4_ = fVar183 * 0.0;
    auVar29._28_4_ = auVar12._28_4_;
    auVar9 = vfnmadd231ps_fma(auVar29,local_98,auVar271);
    auVar30._4_4_ = fStack_154 * fVar180;
    auVar30._0_4_ = local_158 * fVar177;
    auVar30._8_4_ = fStack_150 * fVar258;
    auVar30._12_4_ = fStack_14c * fVar260;
    auVar30._16_4_ = fStack_148 * fVar181;
    auVar30._20_4_ = fStack_144 * fVar182;
    auVar30._24_4_ = fStack_140 * fVar183;
    auVar30._28_4_ = auVar18._28_4_;
    auVar43._4_4_ = fVar179;
    auVar43._0_4_ = fVar158;
    auVar43._8_4_ = fVar246;
    auVar43._12_4_ = fVar259;
    auVar43._16_4_ = fVar235;
    auVar43._20_4_ = fVar236;
    auVar43._24_4_ = fVar237;
    auVar43._28_4_ = 0x40400000;
    auVar70 = vfnmadd231ps_fma(auVar30,auVar271,auVar43);
    auVar31._4_4_ = local_178._4_4_ * fVar180;
    auVar31._0_4_ = local_178._0_4_ * fVar177;
    auVar31._8_4_ = local_178._8_4_ * fVar258;
    auVar31._12_4_ = local_178._12_4_ * fVar260;
    auVar31._16_4_ = local_178._16_4_ * fVar181;
    auVar31._20_4_ = local_178._20_4_ * fVar182;
    auVar31._24_4_ = local_178._24_4_ * fVar183;
    auVar31._28_4_ = fStack_13c;
    auVar276 = vfnmadd231ps_fma(auVar31,local_d8,auVar271);
    local_5a8._0_4_ = auVar16._0_4_;
    local_5a8._4_4_ = auVar16._4_4_;
    uStack_5a0._0_4_ = auVar16._8_4_;
    uStack_5a0._4_4_ = auVar16._12_4_;
    uStack_598._0_4_ = auVar16._16_4_;
    uStack_598._4_4_ = auVar16._20_4_;
    uStack_590._0_4_ = auVar16._24_4_;
    auVar32._4_4_ = fVar180 * (float)local_5a8._4_4_;
    auVar32._0_4_ = fVar177 * (float)local_5a8._0_4_;
    auVar32._8_4_ = fVar258 * (float)uStack_5a0;
    auVar32._12_4_ = fVar260 * uStack_5a0._4_4_;
    auVar32._16_4_ = fVar181 * (float)uStack_598;
    auVar32._20_4_ = fVar182 * uStack_598._4_4_;
    auVar32._24_4_ = fVar183 * (float)uStack_590;
    auVar32._28_4_ = local_178._28_4_;
    auVar64 = vfnmadd231ps_fma(auVar32,local_2a8,auVar271);
    auVar49._4_4_ = fVar152 * fVar180;
    auVar49._0_4_ = fVar137 * fVar177;
    auVar49._8_4_ = fVar153 * fVar258;
    auVar49._12_4_ = fVar154 * fVar260;
    auVar49._16_4_ = fVar181 * 0.0;
    auVar49._20_4_ = fVar182 * 0.0;
    auVar49._24_4_ = fVar183 * 0.0;
    auVar49._28_4_ = DAT_0205d4a0._28_4_;
    auVar63 = vfnmadd231ps_fma(auVar49,auVar257,auVar271);
    auVar33._4_4_ = local_138._4_4_ * fVar180;
    auVar33._0_4_ = local_138._0_4_ * fVar177;
    auVar33._8_4_ = local_138._8_4_ * fVar258;
    auVar33._12_4_ = local_138._12_4_ * fVar260;
    auVar33._16_4_ = local_138._16_4_ * fVar181;
    auVar33._20_4_ = local_138._20_4_ * fVar182;
    auVar33._24_4_ = local_138._24_4_ * fVar183;
    auVar33._28_4_ = local_2a8._28_4_;
    auVar74 = vfnmadd231ps_fma(auVar33,local_f8,auVar271);
    auVar34._4_4_ = local_118._4_4_ * fVar180;
    auVar34._0_4_ = local_118._0_4_ * fVar177;
    auVar34._8_4_ = local_118._8_4_ * fVar258;
    auVar34._12_4_ = local_118._12_4_ * fVar260;
    auVar34._16_4_ = local_118._16_4_ * fVar181;
    auVar34._20_4_ = local_118._20_4_ * fVar182;
    auVar34._24_4_ = local_118._24_4_ * fVar183;
    auVar34._28_4_ = local_d8._28_4_;
    auVar205 = vfnmadd231ps_fma(auVar34,auVar271,auVar18);
    auVar35._4_4_ = local_78._4_4_ * fVar180;
    auVar35._0_4_ = local_78._0_4_ * fVar177;
    auVar35._8_4_ = local_78._8_4_ * fVar258;
    auVar35._12_4_ = local_78._12_4_ * fVar260;
    auVar35._16_4_ = local_78._16_4_ * fVar181;
    auVar35._20_4_ = local_78._20_4_ * fVar182;
    auVar35._24_4_ = local_78._24_4_ * fVar183;
    auVar35._28_4_ = auVar72._28_4_ + auVar14._28_4_;
    auVar75 = vfnmadd231ps_fma(auVar35,auVar271,auVar17);
    auVar12 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar70));
    auVar72 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar70));
    auVar13 = vminps_avx(ZEXT1632(auVar276),ZEXT1632(auVar64));
    auVar13 = vminps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(ZEXT1632(auVar276),ZEXT1632(auVar64));
    auVar72 = vmaxps_avx(auVar72,auVar12);
    auVar14 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar74));
    auVar12 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar74));
    auVar15 = vminps_avx(ZEXT1632(auVar205),ZEXT1632(auVar75));
    auVar14 = vminps_avx(auVar14,auVar15);
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar205),ZEXT1632(auVar75));
    auVar12 = vmaxps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(auVar72,auVar12);
    auVar48._4_4_ = fStack_194;
    auVar48._0_4_ = local_198;
    auVar48._8_4_ = fStack_190;
    auVar48._12_4_ = fStack_18c;
    auVar48._16_4_ = fStack_188;
    auVar48._20_4_ = fStack_184;
    auVar48._24_4_ = fStack_180;
    auVar48._28_4_ = fStack_17c;
    auVar72 = vcmpps_avx(auVar14,auVar48,2);
    auVar47._4_4_ = fStack_1b4;
    auVar47._0_4_ = local_1b8;
    auVar47._8_4_ = fStack_1b0;
    auVar47._12_4_ = fStack_1ac;
    auVar47._16_4_ = fStack_1a8;
    auVar47._20_4_ = fStack_1a4;
    auVar47._24_4_ = fStack_1a0;
    auVar47._28_4_ = fStack_19c;
    auVar12 = vcmpps_avx(auVar12,auVar47,5);
    auVar72 = vandps_avx(auVar12,auVar72);
    auVar12 = local_288 & auVar72;
    uVar51 = 0;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar12 = vsubps_avx(local_2a8,local_98);
      auVar13 = vsubps_avx(auVar17,auVar257);
      fVar156 = auVar12._0_4_ + auVar13._0_4_;
      fVar157 = auVar12._4_4_ + auVar13._4_4_;
      fVar177 = auVar12._8_4_ + auVar13._8_4_;
      fVar180 = auVar12._12_4_ + auVar13._12_4_;
      fVar258 = auVar12._16_4_ + auVar13._16_4_;
      fVar260 = auVar12._20_4_ + auVar13._20_4_;
      fVar181 = auVar12._24_4_ + auVar13._24_4_;
      auVar14 = vsubps_avx(auVar16,local_b8);
      auVar15 = vsubps_avx(local_78,ZEXT1632(auVar98));
      auVar93._0_4_ = auVar14._0_4_ + auVar15._0_4_;
      auVar93._4_4_ = auVar14._4_4_ + auVar15._4_4_;
      auVar93._8_4_ = auVar14._8_4_ + auVar15._8_4_;
      auVar93._12_4_ = auVar14._12_4_ + auVar15._12_4_;
      auVar93._16_4_ = auVar14._16_4_ + auVar15._16_4_;
      auVar93._20_4_ = auVar14._20_4_ + auVar15._20_4_;
      auVar93._24_4_ = auVar14._24_4_ + auVar15._24_4_;
      fVar155 = auVar15._28_4_;
      auVar93._28_4_ = auVar14._28_4_ + fVar155;
      auVar280._0_4_ = fVar96 * fVar156;
      auVar280._4_4_ = fVar97 * fVar157;
      auVar280._8_4_ = fVar62 * fVar177;
      auVar280._12_4_ = fVar178 * fVar180;
      auVar280._16_4_ = fVar258 * 0.0;
      auVar280._20_4_ = fVar260 * 0.0;
      auVar280._24_4_ = fVar181 * 0.0;
      auVar280._28_4_ = 0;
      auVar63 = vfnmadd231ps_fma(auVar280,auVar93,local_98);
      auVar36._4_4_ = fVar157 * fStack_154;
      auVar36._0_4_ = fVar156 * local_158;
      auVar36._8_4_ = fVar177 * fStack_150;
      auVar36._12_4_ = fVar180 * fStack_14c;
      auVar36._16_4_ = fVar258 * fStack_148;
      auVar36._20_4_ = fVar260 * fStack_144;
      auVar36._24_4_ = fVar181 * fStack_140;
      auVar36._28_4_ = fVar155;
      auVar44._4_4_ = fVar179;
      auVar44._0_4_ = fVar158;
      auVar44._8_4_ = fVar246;
      auVar44._12_4_ = fVar259;
      auVar44._16_4_ = fVar235;
      auVar44._20_4_ = fVar236;
      auVar44._24_4_ = fVar237;
      auVar44._28_4_ = 0x40400000;
      auVar9 = vfnmadd213ps_fma(auVar44,auVar93,auVar36);
      auVar37._4_4_ = fVar157 * local_178._4_4_;
      auVar37._0_4_ = fVar156 * local_178._0_4_;
      auVar37._8_4_ = fVar177 * local_178._8_4_;
      auVar37._12_4_ = fVar180 * local_178._12_4_;
      auVar37._16_4_ = fVar258 * local_178._16_4_;
      auVar37._20_4_ = fVar260 * local_178._20_4_;
      auVar37._24_4_ = fVar181 * local_178._24_4_;
      auVar37._28_4_ = fVar155;
      auVar70 = vfnmadd213ps_fma(local_d8,auVar93,auVar37);
      auVar38._4_4_ = (float)local_5a8._4_4_ * fVar157;
      auVar38._0_4_ = (float)local_5a8._0_4_ * fVar156;
      auVar38._8_4_ = (float)uStack_5a0 * fVar177;
      auVar38._12_4_ = uStack_5a0._4_4_ * fVar180;
      auVar38._16_4_ = (float)uStack_598 * fVar258;
      auVar38._20_4_ = uStack_598._4_4_ * fVar260;
      auVar38._24_4_ = (float)uStack_590 * fVar181;
      auVar38._28_4_ = fVar155;
      auVar98 = vfnmadd231ps_fma(auVar38,auVar93,local_2a8);
      auVar108._0_4_ = fVar137 * fVar156;
      auVar108._4_4_ = fVar152 * fVar157;
      auVar108._8_4_ = fVar153 * fVar177;
      auVar108._12_4_ = fVar154 * fVar180;
      auVar108._16_4_ = fVar258 * 0.0;
      auVar108._20_4_ = fVar260 * 0.0;
      auVar108._24_4_ = fVar181 * 0.0;
      auVar108._28_4_ = 0;
      auVar74 = vfnmadd231ps_fma(auVar108,auVar93,auVar257);
      auVar39._4_4_ = fVar157 * local_138._4_4_;
      auVar39._0_4_ = fVar156 * local_138._0_4_;
      auVar39._8_4_ = fVar177 * local_138._8_4_;
      auVar39._12_4_ = fVar180 * local_138._12_4_;
      auVar39._16_4_ = fVar258 * local_138._16_4_;
      auVar39._20_4_ = fVar260 * local_138._20_4_;
      auVar39._24_4_ = fVar181 * local_138._24_4_;
      auVar39._28_4_ = auVar16._28_4_;
      auVar276 = vfnmadd213ps_fma(local_f8,auVar93,auVar39);
      auVar40._4_4_ = fVar157 * local_118._4_4_;
      auVar40._0_4_ = fVar156 * local_118._0_4_;
      auVar40._8_4_ = fVar177 * local_118._8_4_;
      auVar40._12_4_ = fVar180 * local_118._12_4_;
      auVar40._16_4_ = fVar258 * local_118._16_4_;
      auVar40._20_4_ = fVar260 * local_118._20_4_;
      auVar40._24_4_ = fVar181 * local_118._24_4_;
      auVar40._28_4_ = auVar16._28_4_;
      auVar64 = vfnmadd213ps_fma(auVar18,auVar93,auVar40);
      auVar41._4_4_ = local_78._4_4_ * fVar157;
      auVar41._0_4_ = local_78._0_4_ * fVar156;
      auVar41._8_4_ = local_78._8_4_ * fVar177;
      auVar41._12_4_ = local_78._12_4_ * fVar180;
      auVar41._16_4_ = local_78._16_4_ * fVar258;
      auVar41._20_4_ = local_78._20_4_ * fVar260;
      auVar41._24_4_ = local_78._24_4_ * fVar181;
      auVar41._28_4_ = auVar12._28_4_ + auVar13._28_4_;
      auVar205 = vfnmadd231ps_fma(auVar41,auVar93,auVar17);
      auVar13 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar9));
      auVar12 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar9));
      auVar14 = vminps_avx(ZEXT1632(auVar70),ZEXT1632(auVar98));
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(ZEXT1632(auVar70),ZEXT1632(auVar98));
      auVar12 = vmaxps_avx(auVar12,auVar13);
      auVar15 = vminps_avx(ZEXT1632(auVar74),ZEXT1632(auVar276));
      auVar13 = vmaxps_avx(ZEXT1632(auVar74),ZEXT1632(auVar276));
      auVar16 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar205));
      auVar15 = vminps_avx(auVar15,auVar16);
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar205));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vcmpps_avx(auVar15,auVar48,2);
      auVar13 = vcmpps_avx(auVar13,auVar47,5);
      auVar12 = vandps_avx(auVar13,auVar12);
      auVar72 = vandps_avx(auVar72,local_288);
      auVar13 = auVar72 & auVar12;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') {
        auVar72 = vandps_avx(auVar12,auVar72);
        uVar51 = vmovmskps_avx(auVar72);
      }
    }
    if (uVar51 != 0) {
      auStack_3d8[uVar53] = uVar51;
      uVar159 = vmovlps_avx(local_358);
      *(undefined8 *)(&uStack_268 + uVar53 * 2) = uVar159;
      uVar58 = vmovlps_avx(local_668);
      auStack_58[uVar53] = uVar58;
      uVar53 = (ulong)((int)uVar53 + 1);
    }
    do {
      if ((int)uVar53 == 0) {
        uVar61 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar71._4_4_ = uVar61;
        auVar71._0_4_ = uVar61;
        auVar71._8_4_ = uVar61;
        auVar71._12_4_ = uVar61;
        auVar9 = vcmpps_avx(local_3a8,auVar71,2);
        uVar50 = vmovmskps_avx(auVar9);
        uVar50 = (uint)uVar59 & uVar50;
        if (uVar50 == 0) {
          return;
        }
        goto LAB_016d56b3;
      }
      uVar52 = (int)uVar53 - 1;
      uVar54 = (ulong)uVar52;
      uVar57 = auStack_3d8[uVar54];
      uVar51 = (&uStack_268)[uVar54 * 2];
      fVar137 = afStack_264[uVar54 * 2];
      iVar19 = 0;
      for (uVar58 = (ulong)uVar57; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
        iVar19 = iVar19 + 1;
      }
      uVar57 = uVar57 - 1 & uVar57;
      if (uVar57 == 0) {
        uVar53 = (ulong)uVar52;
      }
      local_668._8_8_ = 0;
      local_668._0_8_ = auStack_58[uVar54];
      auStack_3d8[uVar54] = uVar57;
      fVar152 = (float)(iVar19 + 1) * 0.14285715;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * (float)iVar19 * 0.14285715)),ZEXT416(uVar51)
                               ,ZEXT416((uint)(1.0 - (float)iVar19 * 0.14285715)));
      auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * fVar152)),ZEXT416(uVar51),
                                ZEXT416((uint)(1.0 - fVar152)));
      auVar176._0_4_ = auVar9._0_4_;
      fVar152 = auVar70._0_4_;
      fVar137 = fVar152 - auVar176._0_4_;
      if (0.16666667 <= fVar137) break;
      auVar276 = vshufps_avx(local_668,local_668,0x50);
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = &DAT_3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar64 = vsubps_avx(auVar101,auVar276);
      fVar153 = auVar276._0_4_;
      auVar112._0_4_ = fVar153 * (float)local_428._0_4_;
      fVar154 = auVar276._4_4_;
      auVar112._4_4_ = fVar154 * (float)local_428._4_4_;
      fVar96 = auVar276._8_4_;
      auVar112._8_4_ = fVar96 * fStack_420;
      fVar97 = auVar276._12_4_;
      auVar112._12_4_ = fVar97 * fStack_41c;
      auVar125._0_4_ = fVar153 * (float)local_438._0_4_;
      auVar125._4_4_ = fVar154 * (float)local_438._4_4_;
      auVar125._8_4_ = fVar96 * fStack_430;
      auVar125._12_4_ = fVar97 * fStack_42c;
      auVar145._0_4_ = fVar153 * (float)local_448._0_4_;
      auVar145._4_4_ = fVar154 * (float)local_448._4_4_;
      auVar145._8_4_ = fVar96 * fStack_440;
      auVar145._12_4_ = fVar97 * fStack_43c;
      auVar84._0_4_ = fVar153 * (float)local_458._0_4_;
      auVar84._4_4_ = fVar154 * (float)local_458._4_4_;
      auVar84._8_4_ = fVar96 * fStack_450;
      auVar84._12_4_ = fVar97 * fStack_44c;
      auVar276 = vfmadd231ps_fma(auVar112,auVar64,local_3e8);
      auVar63 = vfmadd231ps_fma(auVar125,auVar64,local_3f8);
      auVar98 = vfmadd231ps_fma(auVar145,auVar64,local_408);
      auVar64 = vfmadd231ps_fma(auVar84,auVar64,local_418);
      auVar109._16_16_ = auVar276;
      auVar109._0_16_ = auVar276;
      auVar118._16_16_ = auVar63;
      auVar118._0_16_ = auVar63;
      auVar136._16_16_ = auVar98;
      auVar136._0_16_ = auVar98;
      auVar176._4_4_ = auVar176._0_4_;
      auVar176._8_4_ = auVar176._0_4_;
      auVar176._12_4_ = auVar176._0_4_;
      auVar176._20_4_ = fVar152;
      auVar176._16_4_ = fVar152;
      auVar176._24_4_ = fVar152;
      auVar176._28_4_ = fVar152;
      auVar72 = vsubps_avx(auVar118,auVar109);
      auVar63 = vfmadd213ps_fma(auVar72,auVar176,auVar109);
      auVar72 = vsubps_avx(auVar136,auVar118);
      auVar74 = vfmadd213ps_fma(auVar72,auVar176,auVar118);
      auVar276 = vsubps_avx(auVar64,auVar98);
      auVar119._16_16_ = auVar276;
      auVar119._0_16_ = auVar276;
      auVar276 = vfmadd213ps_fma(auVar119,auVar176,auVar136);
      auVar72 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar63));
      auVar64 = vfmadd213ps_fma(auVar72,auVar176,ZEXT1632(auVar63));
      auVar72 = vsubps_avx(ZEXT1632(auVar276),ZEXT1632(auVar74));
      auVar276 = vfmadd213ps_fma(auVar72,auVar176,ZEXT1632(auVar74));
      auVar72 = vsubps_avx(ZEXT1632(auVar276),ZEXT1632(auVar64));
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar72,auVar176);
      fVar178 = auVar72._4_4_ * 3.0;
      fVar62 = fVar137 * 0.33333334;
      local_2a8._0_8_ =
           CONCAT44(auVar110._4_4_ + fVar62 * fVar178,auVar110._0_4_ + fVar62 * auVar72._0_4_ * 3.0)
      ;
      local_2a8._8_4_ = auVar110._8_4_ + fVar62 * auVar72._8_4_ * 3.0;
      local_2a8._12_4_ = auVar110._12_4_ + fVar62 * auVar72._12_4_ * 3.0;
      auVar64 = vshufpd_avx(auVar110,auVar110,3);
      auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar276 = vsubps_avx(auVar64,auVar110);
      auVar98 = vsubps_avx(auVar63,(undefined1  [16])0x0);
      auVar102._0_4_ = auVar276._0_4_ + auVar98._0_4_;
      auVar102._4_4_ = auVar276._4_4_ + auVar98._4_4_;
      auVar102._8_4_ = auVar276._8_4_ + auVar98._8_4_;
      auVar102._12_4_ = auVar276._12_4_ + auVar98._12_4_;
      auVar276 = vshufps_avx(auVar110,auVar110,0xb1);
      auVar98 = vshufps_avx(local_2a8._0_16_,local_2a8._0_16_,0xb1);
      auVar262._4_4_ = auVar102._0_4_;
      auVar262._0_4_ = auVar102._0_4_;
      auVar262._8_4_ = auVar102._0_4_;
      auVar262._12_4_ = auVar102._0_4_;
      auVar74 = vshufps_avx(auVar102,auVar102,0x55);
      fVar153 = auVar74._0_4_;
      auVar188._0_4_ = auVar276._0_4_ * fVar153;
      fVar154 = auVar74._4_4_;
      auVar188._4_4_ = auVar276._4_4_ * fVar154;
      fVar96 = auVar74._8_4_;
      auVar188._8_4_ = auVar276._8_4_ * fVar96;
      fVar97 = auVar74._12_4_;
      auVar188._12_4_ = auVar276._12_4_ * fVar97;
      auVar203._0_4_ = auVar98._0_4_ * fVar153;
      auVar203._4_4_ = auVar98._4_4_ * fVar154;
      auVar203._8_4_ = auVar98._8_4_ * fVar96;
      auVar203._12_4_ = auVar98._12_4_ * fVar97;
      auVar205 = vfmadd231ps_fma(auVar188,auVar262,auVar110);
      auVar75 = vfmadd231ps_fma(auVar203,auVar262,local_2a8._0_16_);
      auVar98 = vshufps_avx(auVar205,auVar205,0xe8);
      auVar74 = vshufps_avx(auVar75,auVar75,0xe8);
      auVar276 = vcmpps_avx(auVar98,auVar74,1);
      uVar51 = vextractps_avx(auVar276,0);
      auVar66 = auVar75;
      if ((uVar51 & 1) == 0) {
        auVar66 = auVar205;
      }
      auVar126._0_4_ = fVar62 * auVar72._16_4_ * 3.0;
      auVar126._4_4_ = fVar62 * fVar178;
      auVar126._8_4_ = fVar62 * auVar72._24_4_ * 3.0;
      auVar126._12_4_ = fVar62 * fVar152;
      auVar138 = vsubps_avx((undefined1  [16])0x0,auVar126);
      auVar127 = vshufps_avx(auVar138,auVar138,0xb1);
      auVar73 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar282._0_4_ = auVar127._0_4_ * fVar153;
      auVar282._4_4_ = auVar127._4_4_ * fVar154;
      auVar282._8_4_ = auVar127._8_4_ * fVar96;
      auVar282._12_4_ = auVar127._12_4_ * fVar97;
      auVar103._0_4_ = auVar73._0_4_ * fVar153;
      auVar103._4_4_ = auVar73._4_4_ * fVar154;
      auVar103._8_4_ = auVar73._8_4_ * fVar96;
      auVar103._12_4_ = auVar73._12_4_ * fVar97;
      auVar139 = vfmadd231ps_fma(auVar282,auVar262,auVar138);
      auVar140 = vfmadd231ps_fma(auVar103,(undefined1  [16])0x0,auVar262);
      auVar73 = vshufps_avx(auVar139,auVar139,0xe8);
      auVar120 = vshufps_avx(auVar140,auVar140,0xe8);
      auVar127 = vcmpps_avx(auVar73,auVar120,1);
      uVar51 = vextractps_avx(auVar127,0);
      auVar184 = auVar140;
      if ((uVar51 & 1) == 0) {
        auVar184 = auVar139;
      }
      auVar66 = vmaxss_avx(auVar184,auVar66);
      auVar98 = vminps_avx(auVar98,auVar74);
      auVar74 = vminps_avx(auVar73,auVar120);
      auVar74 = vminps_avx(auVar98,auVar74);
      auVar276 = vshufps_avx(auVar276,auVar276,0x55);
      auVar276 = vblendps_avx(auVar276,auVar127,2);
      auVar127 = vpslld_avx(auVar276,0x1f);
      auVar276 = vshufpd_avx(auVar75,auVar75,1);
      auVar276 = vinsertps_avx(auVar276,auVar140,0x9c);
      auVar98 = vshufpd_avx(auVar205,auVar205,1);
      auVar98 = vinsertps_avx(auVar98,auVar139,0x9c);
      auVar276 = vblendvps_avx(auVar98,auVar276,auVar127);
      auVar98 = vmovshdup_avx(auVar276);
      auVar276 = vmaxss_avx(auVar98,auVar276);
      fVar96 = auVar74._0_4_;
      auVar98 = vmovshdup_avx(auVar74);
      fVar154 = auVar276._0_4_;
      fVar153 = auVar66._0_4_;
      if ((0.0001 <= fVar96) || (fVar154 <= -0.0001)) {
        auVar205 = vcmpps_avx(auVar98,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar75 = vcmpps_avx(auVar74,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar205 = vorps_avx(auVar75,auVar205);
        if ((-0.0001 < fVar153 & auVar205[0]) != 0) goto LAB_016d67b6;
        auVar205 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar276,5);
        auVar75 = vcmpps_avx(auVar98,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar205 = vorps_avx(auVar75,auVar205);
        if ((auVar205 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_016d67b6;
LAB_016d717d:
        bVar42 = true;
      }
      else {
LAB_016d67b6:
        auVar75 = vcmpps_avx(auVar74,_DAT_01feba10,1);
        auVar127 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar205 = vcmpss_avx(auVar66,ZEXT816(0) << 0x20,1);
        auVar146._8_4_ = 0x3f800000;
        auVar146._0_8_ = &DAT_3f8000003f800000;
        auVar146._12_4_ = 0x3f800000;
        auVar204._8_4_ = 0xbf800000;
        auVar204._0_8_ = 0xbf800000bf800000;
        auVar204._12_4_ = 0xbf800000;
        auVar205 = vblendvps_avx(auVar146,auVar204,auVar205);
        auVar75 = vblendvps_avx(auVar146,auVar204,auVar75);
        fVar97 = auVar75._0_4_;
        fVar62 = auVar205._0_4_;
        auVar205 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar97 == fVar62) && (!NAN(fVar97) && !NAN(fVar62))) {
          auVar205 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar73 = ZEXT816(0) << 0x20;
        if ((fVar97 == fVar62) && (!NAN(fVar97) && !NAN(fVar62))) {
          auVar127 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar75 = vmovshdup_avx(auVar75);
        fVar178 = auVar75._0_4_;
        if ((fVar97 != fVar178) || (NAN(fVar97) || NAN(fVar178))) {
          fVar97 = auVar98._0_4_;
          if ((fVar97 != fVar96) || (NAN(fVar97) || NAN(fVar96))) {
            auVar104._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
            auVar104._8_4_ = auVar74._8_4_ ^ 0x80000000;
            auVar104._12_4_ = auVar74._12_4_ ^ 0x80000000;
            auVar128._0_4_ = -fVar96 / (fVar97 - fVar96);
            auVar128._4_12_ = auVar104._4_12_;
            auVar98 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar73,auVar128);
            auVar74 = auVar98;
          }
          else {
            auVar98 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar96 == 0.0) && (auVar98 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar96))) {
              auVar98 = ZEXT816(0);
            }
            auVar74 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar96 == 0.0) && (auVar74 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar96))) {
              auVar74 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar205 = vminss_avx(auVar205,auVar98);
          auVar127 = vmaxss_avx(auVar74,auVar127);
        }
        auVar276 = vcmpss_avx(auVar276,auVar73,1);
        auVar129._8_4_ = 0x3f800000;
        auVar129._0_8_ = &DAT_3f8000003f800000;
        auVar129._12_4_ = 0x3f800000;
        auVar147._8_4_ = 0xbf800000;
        auVar147._0_8_ = 0xbf800000bf800000;
        auVar147._12_4_ = 0xbf800000;
        auVar276 = vblendvps_avx(auVar129,auVar147,auVar276);
        fVar96 = auVar276._0_4_;
        auVar276 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar62 != fVar96) || (NAN(fVar62) || NAN(fVar96))) {
          if ((fVar154 != fVar153) || (NAN(fVar154) || NAN(fVar153))) {
            auVar105._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
            auVar105._8_4_ = auVar66._8_4_ ^ 0x80000000;
            auVar105._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar130._0_4_ = -fVar153 / (fVar154 - fVar153);
            auVar130._4_12_ = auVar105._4_12_;
            auVar98 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar73,auVar130);
            auVar74 = auVar98;
          }
          else {
            auVar98 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar153 == 0.0) && (auVar98 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar153))) {
              auVar98 = ZEXT816(0);
            }
            auVar74 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar153 == 0.0) && (auVar74 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar153))) {
              auVar74 = auVar276;
            }
          }
          auVar205 = vminss_avx(auVar205,auVar98);
          auVar127 = vmaxss_avx(auVar74,auVar127);
        }
        if ((fVar178 != fVar96) || (NAN(fVar178) || NAN(fVar96))) {
          auVar205 = vminss_avx(auVar205,auVar276);
          auVar127 = vmaxss_avx(auVar276,auVar127);
        }
        auVar98 = vmaxss_avx(auVar73,auVar205);
        auVar74 = vminss_avx(auVar127,auVar276);
        bVar42 = true;
        if (auVar98._0_4_ <= auVar74._0_4_) {
          auVar98 = vmaxss_avx(auVar73,ZEXT416((uint)(auVar98._0_4_ + -0.1)));
          auVar276 = vminss_avx(ZEXT416((uint)(auVar74._0_4_ + 0.1)),auVar276);
          auVar85._0_8_ = auVar110._0_8_;
          auVar85._8_8_ = auVar85._0_8_;
          auVar206._8_8_ = local_2a8._0_8_;
          auVar206._0_8_ = local_2a8._0_8_;
          auVar220._8_8_ = auVar138._0_8_;
          auVar220._0_8_ = auVar138._0_8_;
          auVar74 = vshufpd_avx(local_2a8._0_16_,local_2a8._0_16_,3);
          auVar205 = vshufpd_avx(auVar138,auVar138,3);
          auVar75 = vshufps_avx(auVar98,auVar276,0);
          auVar113._8_4_ = 0x3f800000;
          auVar113._0_8_ = &DAT_3f8000003f800000;
          auVar113._12_4_ = 0x3f800000;
          auVar110 = vsubps_avx(auVar113,auVar75);
          local_588._0_4_ = auVar64._0_4_;
          local_588._4_4_ = auVar64._4_4_;
          fStack_580 = auVar64._8_4_;
          fStack_57c = auVar64._12_4_;
          fVar153 = auVar75._0_4_;
          auVar114._0_4_ = fVar153 * (float)local_588._0_4_;
          fVar154 = auVar75._4_4_;
          auVar114._4_4_ = fVar154 * (float)local_588._4_4_;
          fVar96 = auVar75._8_4_;
          auVar114._8_4_ = fVar96 * fStack_580;
          fVar97 = auVar75._12_4_;
          auVar114._12_4_ = fVar97 * fStack_57c;
          auVar131._0_4_ = auVar74._0_4_ * fVar153;
          auVar131._4_4_ = auVar74._4_4_ * fVar154;
          auVar131._8_4_ = auVar74._8_4_ * fVar96;
          auVar131._12_4_ = auVar74._12_4_ * fVar97;
          auVar148._0_4_ = auVar205._0_4_ * fVar153;
          auVar148._4_4_ = auVar205._4_4_ * fVar154;
          auVar148._8_4_ = auVar205._8_4_ * fVar96;
          auVar148._12_4_ = auVar205._12_4_ * fVar97;
          local_5a8._0_4_ = auVar63._0_4_;
          local_5a8._4_4_ = auVar63._4_4_;
          uStack_5a0._0_4_ = auVar63._8_4_;
          uStack_5a0._4_4_ = auVar63._12_4_;
          auVar171._0_4_ = fVar153 * (float)local_5a8._0_4_;
          auVar171._4_4_ = fVar154 * (float)local_5a8._4_4_;
          auVar171._8_4_ = fVar96 * (float)uStack_5a0;
          auVar171._12_4_ = fVar97 * uStack_5a0._4_4_;
          auVar74 = vfmadd231ps_fma(auVar114,auVar110,auVar85);
          auVar205 = vfmadd231ps_fma(auVar131,auVar110,auVar206);
          auVar75 = vfmadd231ps_fma(auVar148,auVar110,auVar220);
          auVar110 = vfmadd231ps_fma(auVar171,auVar110,ZEXT816(0));
          auVar64 = vmovshdup_avx(local_668);
          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar98._0_4_)),local_668,
                                    ZEXT416((uint)(1.0 - auVar98._0_4_)));
          auVar120 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar276._0_4_)),local_668,
                                     ZEXT416((uint)(1.0 - auVar276._0_4_)));
          fVar153 = 1.0 / fVar137;
          auVar276 = vsubps_avx(auVar205,auVar74);
          auVar189._0_4_ = auVar276._0_4_ * 3.0;
          auVar189._4_4_ = auVar276._4_4_ * 3.0;
          auVar189._8_4_ = auVar276._8_4_ * 3.0;
          auVar189._12_4_ = auVar276._12_4_ * 3.0;
          auVar276 = vsubps_avx(auVar75,auVar205);
          auVar207._0_4_ = auVar276._0_4_ * 3.0;
          auVar207._4_4_ = auVar276._4_4_ * 3.0;
          auVar207._8_4_ = auVar276._8_4_ * 3.0;
          auVar207._12_4_ = auVar276._12_4_ * 3.0;
          auVar276 = vsubps_avx(auVar110,auVar75);
          auVar221._0_4_ = auVar276._0_4_ * 3.0;
          auVar221._4_4_ = auVar276._4_4_ * 3.0;
          auVar221._8_4_ = auVar276._8_4_ * 3.0;
          auVar221._12_4_ = auVar276._12_4_ * 3.0;
          auVar64 = vminps_avx(auVar207,auVar221);
          auVar276 = vmaxps_avx(auVar207,auVar221);
          auVar64 = vminps_avx(auVar189,auVar64);
          auVar276 = vmaxps_avx(auVar189,auVar276);
          auVar63 = vshufpd_avx(auVar64,auVar64,3);
          auVar98 = vshufpd_avx(auVar276,auVar276,3);
          auVar64 = vminps_avx(auVar64,auVar63);
          auVar276 = vmaxps_avx(auVar276,auVar98);
          auVar208._0_4_ = auVar64._0_4_ * fVar153;
          auVar208._4_4_ = auVar64._4_4_ * fVar153;
          auVar208._8_4_ = auVar64._8_4_ * fVar153;
          auVar208._12_4_ = auVar64._12_4_ * fVar153;
          auVar190._0_4_ = fVar153 * auVar276._0_4_;
          auVar190._4_4_ = fVar153 * auVar276._4_4_;
          auVar190._8_4_ = fVar153 * auVar276._8_4_;
          auVar190._12_4_ = fVar153 * auVar276._12_4_;
          fVar153 = 1.0 / (auVar120._0_4_ - auVar73._0_4_);
          auVar276 = vshufpd_avx(auVar74,auVar74,3);
          auVar64 = vshufpd_avx(auVar205,auVar205,3);
          auVar63 = vshufpd_avx(auVar75,auVar75,3);
          auVar98 = vshufpd_avx(auVar110,auVar110,3);
          auVar276 = vsubps_avx(auVar276,auVar74);
          auVar74 = vsubps_avx(auVar64,auVar205);
          auVar205 = vsubps_avx(auVar63,auVar75);
          auVar98 = vsubps_avx(auVar98,auVar110);
          auVar64 = vminps_avx(auVar276,auVar74);
          auVar276 = vmaxps_avx(auVar276,auVar74);
          auVar63 = vminps_avx(auVar205,auVar98);
          auVar63 = vminps_avx(auVar64,auVar63);
          auVar64 = vmaxps_avx(auVar205,auVar98);
          auVar276 = vmaxps_avx(auVar276,auVar64);
          auVar240._0_4_ = fVar153 * auVar63._0_4_;
          auVar240._4_4_ = fVar153 * auVar63._4_4_;
          auVar240._8_4_ = fVar153 * auVar63._8_4_;
          auVar240._12_4_ = fVar153 * auVar63._12_4_;
          auVar228._0_4_ = fVar153 * auVar276._0_4_;
          auVar228._4_4_ = fVar153 * auVar276._4_4_;
          auVar228._8_4_ = fVar153 * auVar276._8_4_;
          auVar228._12_4_ = fVar153 * auVar276._12_4_;
          auVar98 = vinsertps_avx(auVar9,auVar73,0x10);
          auVar74 = vinsertps_avx(auVar70,auVar120,0x10);
          auVar69._0_4_ = (auVar98._0_4_ + auVar74._0_4_) * 0.5;
          auVar69._4_4_ = (auVar98._4_4_ + auVar74._4_4_) * 0.5;
          auVar69._8_4_ = (auVar98._8_4_ + auVar74._8_4_) * 0.5;
          auVar69._12_4_ = (auVar98._12_4_ + auVar74._12_4_) * 0.5;
          auVar115._4_4_ = auVar69._0_4_;
          auVar115._0_4_ = auVar69._0_4_;
          auVar115._8_4_ = auVar69._0_4_;
          auVar115._12_4_ = auVar69._0_4_;
          auVar276 = vfmadd213ps_fma(local_2b8,auVar115,auVar77);
          auVar64 = vfmadd213ps_fma(local_2c8,auVar115,auVar10);
          auVar63 = vfmadd213ps_fma(local_2d8,auVar115,auVar11);
          auVar70 = vsubps_avx(auVar64,auVar276);
          auVar276 = vfmadd213ps_fma(auVar70,auVar115,auVar276);
          auVar70 = vsubps_avx(auVar63,auVar64);
          auVar70 = vfmadd213ps_fma(auVar70,auVar115,auVar64);
          auVar70 = vsubps_avx(auVar70,auVar276);
          auVar276 = vfmadd231ps_fma(auVar276,auVar70,auVar115);
          auVar116._0_8_ = CONCAT44(auVar70._4_4_ * 3.0,auVar70._0_4_ * 3.0);
          auVar116._8_4_ = auVar70._8_4_ * 3.0;
          auVar116._12_4_ = auVar70._12_4_ * 3.0;
          auVar222._8_8_ = auVar276._0_8_;
          auVar222._0_8_ = auVar276._0_8_;
          auVar70 = vshufpd_avx(auVar276,auVar276,3);
          auVar276 = vshufps_avx(auVar69,auVar69,0x55);
          auVar205 = vsubps_avx(auVar70,auVar222);
          auVar110 = vfmadd231ps_fma(auVar222,auVar276,auVar205);
          auVar263._8_8_ = auVar116._0_8_;
          auVar263._0_8_ = auVar116._0_8_;
          auVar70 = vshufpd_avx(auVar116,auVar116,3);
          auVar70 = vsubps_avx(auVar70,auVar263);
          auVar75 = vfmadd213ps_fma(auVar70,auVar276,auVar263);
          auVar276 = vmovshdup_avx(auVar75);
          auVar264._0_8_ = auVar276._0_8_ ^ 0x8000000080000000;
          auVar264._8_4_ = auVar276._8_4_ ^ 0x80000000;
          auVar264._12_4_ = auVar276._12_4_ ^ 0x80000000;
          auVar64 = vmovshdup_avx(auVar205);
          auVar70 = vunpcklps_avx(auVar64,auVar264);
          auVar63 = vshufps_avx(auVar70,auVar264,4);
          auVar283._0_8_ = auVar205._0_8_ ^ 0x8000000080000000;
          auVar283._8_4_ = auVar205._8_4_ ^ 0x80000000;
          auVar283._12_4_ = auVar205._12_4_ ^ 0x80000000;
          auVar70 = vmovlhps_avx(auVar283,auVar75);
          auVar70 = vshufps_avx(auVar70,auVar75,8);
          auVar276 = vfmsub231ss_fma(ZEXT416((uint)(auVar276._0_4_ * auVar205._0_4_)),auVar64,
                                     auVar75);
          auVar132._0_4_ = auVar276._0_4_;
          auVar132._4_4_ = auVar132._0_4_;
          auVar132._8_4_ = auVar132._0_4_;
          auVar132._12_4_ = auVar132._0_4_;
          auVar276 = vdivps_avx(auVar63,auVar132);
          auVar64 = vdivps_avx(auVar70,auVar132);
          fVar96 = auVar110._0_4_;
          fVar153 = auVar276._0_4_;
          auVar70 = vshufps_avx(auVar110,auVar110,0x55);
          fVar154 = auVar64._0_4_;
          local_5a8._4_4_ = fVar96 * auVar276._4_4_ + auVar70._4_4_ * auVar64._4_4_;
          local_5a8._0_4_ = fVar96 * fVar153 + auVar70._0_4_ * fVar154;
          uStack_5a0._0_4_ = fVar96 * auVar276._8_4_ + auVar70._8_4_ * auVar64._8_4_;
          uStack_5a0._4_4_ = fVar96 * auVar276._12_4_ + auVar70._12_4_ * auVar64._12_4_;
          auVar205 = vmovshdup_avx(auVar276);
          auVar70 = vinsertps_avx(auVar208,auVar240,0x1c);
          auVar277._0_4_ = auVar205._0_4_ * auVar70._0_4_;
          auVar277._4_4_ = auVar205._4_4_ * auVar70._4_4_;
          auVar277._8_4_ = auVar205._8_4_ * auVar70._8_4_;
          auVar277._12_4_ = auVar205._12_4_ * auVar70._12_4_;
          auVar63 = vinsertps_avx(auVar190,auVar228,0x1c);
          auVar250._0_4_ = auVar205._0_4_ * auVar63._0_4_;
          auVar250._4_4_ = auVar205._4_4_ * auVar63._4_4_;
          auVar250._8_4_ = auVar205._8_4_ * auVar63._8_4_;
          auVar250._12_4_ = auVar205._12_4_ * auVar63._12_4_;
          auVar66 = vminps_avx(auVar277,auVar250);
          auVar110 = vmaxps_avx(auVar250,auVar277);
          auVar205 = vinsertps_avx(auVar240,auVar208,0x4c);
          auVar127 = vmovshdup_avx(auVar64);
          auVar75 = vinsertps_avx(auVar228,auVar190,0x4c);
          auVar229._0_4_ = auVar127._0_4_ * auVar205._0_4_;
          auVar229._4_4_ = auVar127._4_4_ * auVar205._4_4_;
          auVar229._8_4_ = auVar127._8_4_ * auVar205._8_4_;
          auVar229._12_4_ = auVar127._12_4_ * auVar205._12_4_;
          auVar241._0_4_ = auVar127._0_4_ * auVar75._0_4_;
          auVar241._4_4_ = auVar127._4_4_ * auVar75._4_4_;
          auVar241._8_4_ = auVar127._8_4_ * auVar75._8_4_;
          auVar241._12_4_ = auVar127._12_4_ * auVar75._12_4_;
          auVar127 = vminps_avx(auVar229,auVar241);
          auVar86._0_4_ = auVar127._0_4_ + auVar66._0_4_;
          auVar86._4_4_ = auVar127._4_4_ + auVar66._4_4_;
          auVar86._8_4_ = auVar127._8_4_ + auVar66._8_4_;
          auVar86._12_4_ = auVar127._12_4_ + auVar66._12_4_;
          auVar66 = vmaxps_avx(auVar241,auVar229);
          auVar230._0_4_ = auVar110._0_4_ + auVar66._0_4_;
          auVar230._4_4_ = auVar110._4_4_ + auVar66._4_4_;
          auVar230._8_4_ = auVar110._8_4_ + auVar66._8_4_;
          auVar230._12_4_ = auVar110._12_4_ + auVar66._12_4_;
          auVar242._8_8_ = 0x3f80000000000000;
          auVar242._0_8_ = 0x3f80000000000000;
          auVar110 = vsubps_avx(auVar242,auVar230);
          auVar66 = vsubps_avx(auVar242,auVar86);
          auVar127 = vsubps_avx(auVar98,auVar69);
          auVar265._0_4_ = fVar153 * auVar70._0_4_;
          auVar265._4_4_ = fVar153 * auVar70._4_4_;
          auVar265._8_4_ = fVar153 * auVar70._8_4_;
          auVar265._12_4_ = fVar153 * auVar70._12_4_;
          auVar251._0_4_ = fVar153 * auVar63._0_4_;
          auVar251._4_4_ = fVar153 * auVar63._4_4_;
          auVar251._8_4_ = fVar153 * auVar63._8_4_;
          auVar251._12_4_ = fVar153 * auVar63._12_4_;
          auVar63 = vminps_avx(auVar265,auVar251);
          auVar70 = vmaxps_avx(auVar251,auVar265);
          auVar209._0_4_ = fVar154 * auVar205._0_4_;
          auVar209._4_4_ = fVar154 * auVar205._4_4_;
          auVar209._8_4_ = fVar154 * auVar205._8_4_;
          auVar209._12_4_ = fVar154 * auVar205._12_4_;
          auVar191._0_4_ = fVar154 * auVar75._0_4_;
          auVar191._4_4_ = fVar154 * auVar75._4_4_;
          auVar191._8_4_ = fVar154 * auVar75._8_4_;
          auVar191._12_4_ = fVar154 * auVar75._12_4_;
          auVar205 = vminps_avx(auVar209,auVar191);
          auVar266._0_4_ = auVar63._0_4_ + auVar205._0_4_;
          auVar266._4_4_ = auVar63._4_4_ + auVar205._4_4_;
          auVar266._8_4_ = auVar63._8_4_ + auVar205._8_4_;
          auVar266._12_4_ = auVar63._12_4_ + auVar205._12_4_;
          auVar205 = vsubps_avx(auVar74,auVar69);
          auVar63 = vmaxps_avx(auVar191,auVar209);
          fVar96 = auVar127._0_4_;
          auVar210._0_4_ = fVar96 * auVar110._0_4_;
          fVar97 = auVar127._4_4_;
          auVar210._4_4_ = fVar97 * auVar110._4_4_;
          fVar62 = auVar127._8_4_;
          auVar210._8_4_ = fVar62 * auVar110._8_4_;
          fVar178 = auVar127._12_4_;
          auVar210._12_4_ = fVar178 * auVar110._12_4_;
          auVar192._0_4_ = auVar70._0_4_ + auVar63._0_4_;
          auVar192._4_4_ = auVar70._4_4_ + auVar63._4_4_;
          auVar192._8_4_ = auVar70._8_4_ + auVar63._8_4_;
          auVar192._12_4_ = auVar70._12_4_ + auVar63._12_4_;
          auVar252._8_8_ = 0x3f800000;
          auVar252._0_8_ = 0x3f800000;
          auVar70 = vsubps_avx(auVar252,auVar192);
          auVar63 = vsubps_avx(auVar252,auVar266);
          auVar267._0_4_ = fVar96 * auVar66._0_4_;
          auVar267._4_4_ = fVar97 * auVar66._4_4_;
          auVar267._8_4_ = fVar62 * auVar66._8_4_;
          auVar267._12_4_ = fVar178 * auVar66._12_4_;
          fVar155 = auVar205._0_4_;
          auVar231._0_4_ = fVar155 * auVar110._0_4_;
          fVar156 = auVar205._4_4_;
          auVar231._4_4_ = fVar156 * auVar110._4_4_;
          fVar157 = auVar205._8_4_;
          auVar231._8_4_ = fVar157 * auVar110._8_4_;
          fVar158 = auVar205._12_4_;
          auVar231._12_4_ = fVar158 * auVar110._12_4_;
          auVar87._0_4_ = fVar155 * auVar66._0_4_;
          auVar87._4_4_ = fVar156 * auVar66._4_4_;
          auVar87._8_4_ = fVar157 * auVar66._8_4_;
          auVar87._12_4_ = fVar158 * auVar66._12_4_;
          auVar284._0_4_ = fVar96 * auVar70._0_4_;
          auVar284._4_4_ = fVar97 * auVar70._4_4_;
          auVar284._8_4_ = fVar62 * auVar70._8_4_;
          auVar284._12_4_ = fVar178 * auVar70._12_4_;
          auVar243._0_4_ = fVar96 * auVar63._0_4_;
          auVar243._4_4_ = fVar97 * auVar63._4_4_;
          auVar243._8_4_ = fVar62 * auVar63._8_4_;
          auVar243._12_4_ = fVar178 * auVar63._12_4_;
          auVar193._0_4_ = fVar155 * auVar70._0_4_;
          auVar193._4_4_ = fVar156 * auVar70._4_4_;
          auVar193._8_4_ = fVar157 * auVar70._8_4_;
          auVar193._12_4_ = fVar158 * auVar70._12_4_;
          auVar253._0_4_ = fVar155 * auVar63._0_4_;
          auVar253._4_4_ = fVar156 * auVar63._4_4_;
          auVar253._8_4_ = fVar157 * auVar63._8_4_;
          auVar253._12_4_ = fVar158 * auVar63._12_4_;
          auVar70 = vminps_avx(auVar284,auVar243);
          auVar63 = vminps_avx(auVar193,auVar253);
          auVar70 = vminps_avx(auVar70,auVar63);
          auVar63 = vmaxps_avx(auVar243,auVar284);
          auVar205 = vminps_avx(auVar210,auVar267);
          auVar75 = vminps_avx(auVar231,auVar87);
          auVar205 = vminps_avx(auVar205,auVar75);
          auVar70 = vhaddps_avx(auVar70,auVar205);
          auVar205 = vmaxps_avx(auVar253,auVar193);
          auVar63 = vmaxps_avx(auVar205,auVar63);
          auVar205 = vmaxps_avx(auVar267,auVar210);
          auVar75 = vmaxps_avx(auVar87,auVar231);
          auVar205 = vmaxps_avx(auVar75,auVar205);
          auVar63 = vhaddps_avx(auVar63,auVar205);
          auVar205 = vshufps_avx(auVar69,auVar69,0x54);
          auVar205 = vsubps_avx(auVar205,_local_5a8);
          auVar70 = vshufps_avx(auVar70,auVar70,0xe8);
          auVar63 = vshufps_avx(auVar63,auVar63,0xe8);
          auVar211._0_4_ = auVar205._0_4_ + auVar70._0_4_;
          auVar211._4_4_ = auVar205._4_4_ + auVar70._4_4_;
          auVar211._8_4_ = auVar205._8_4_ + auVar70._8_4_;
          auVar211._12_4_ = auVar205._12_4_ + auVar70._12_4_;
          auVar194._0_4_ = auVar205._0_4_ + auVar63._0_4_;
          auVar194._4_4_ = auVar205._4_4_ + auVar63._4_4_;
          auVar194._8_4_ = auVar205._8_4_ + auVar63._8_4_;
          auVar194._12_4_ = auVar205._12_4_ + auVar63._12_4_;
          auVar70 = vmaxps_avx(auVar98,auVar211);
          auVar63 = vminps_avx(auVar194,auVar74);
          auVar70 = vcmpps_avx(auVar63,auVar70,1);
          auVar70 = vshufps_avx(auVar70,auVar70,0x50);
          local_668 = vinsertps_avx(auVar73,ZEXT416((uint)auVar120._0_4_),0x10);
          if ((auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar70[0xf] < '\0') goto LAB_016d717d;
          bVar56 = 0;
          if ((auVar176._0_4_ < auVar211._0_4_) && (bVar56 = 0, auVar194._0_4_ < auVar74._0_4_)) {
            auVar63 = vmovshdup_avx(auVar211);
            auVar70 = vcmpps_avx(auVar194,auVar74,1);
            bVar56 = auVar70[4] & auVar73._0_4_ < auVar63._0_4_;
          }
          if (((3 < (uint)uVar53 || fVar137 < 0.001) | bVar56) == 1) {
            lVar55 = 200;
            do {
              fVar62 = auVar205._0_4_;
              fVar97 = 1.0 - fVar62;
              fVar137 = fVar97 * fVar97 * fVar97;
              fVar96 = fVar62 * 3.0 * fVar97 * fVar97;
              fVar97 = fVar97 * fVar62 * fVar62 * 3.0;
              auVar149._4_4_ = fVar137;
              auVar149._0_4_ = fVar137;
              auVar149._8_4_ = fVar137;
              auVar149._12_4_ = fVar137;
              auVar106._4_4_ = fVar96;
              auVar106._0_4_ = fVar96;
              auVar106._8_4_ = fVar96;
              auVar106._12_4_ = fVar96;
              auVar88._4_4_ = fVar97;
              auVar88._0_4_ = fVar97;
              auVar88._8_4_ = fVar97;
              auVar88._12_4_ = fVar97;
              fVar62 = fVar62 * fVar62 * fVar62;
              auVar172._0_4_ = (float)local_468._0_4_ * fVar62;
              auVar172._4_4_ = (float)local_468._4_4_ * fVar62;
              auVar172._8_4_ = fStack_460 * fVar62;
              auVar172._12_4_ = fStack_45c * fVar62;
              auVar70 = vfmadd231ps_fma(auVar172,auVar11,auVar88);
              auVar70 = vfmadd231ps_fma(auVar70,auVar10,auVar106);
              auVar70 = vfmadd231ps_fma(auVar70,auVar77,auVar149);
              auVar89._8_8_ = auVar70._0_8_;
              auVar89._0_8_ = auVar70._0_8_;
              auVar70 = vshufpd_avx(auVar70,auVar70,3);
              auVar63 = vshufps_avx(auVar205,auVar205,0x55);
              auVar70 = vsubps_avx(auVar70,auVar89);
              auVar63 = vfmadd213ps_fma(auVar70,auVar63,auVar89);
              fVar137 = auVar63._0_4_;
              auVar70 = vshufps_avx(auVar63,auVar63,0x55);
              auVar90._0_4_ = fVar153 * fVar137 + fVar154 * auVar70._0_4_;
              auVar90._4_4_ = auVar276._4_4_ * fVar137 + auVar64._4_4_ * auVar70._4_4_;
              auVar90._8_4_ = auVar276._8_4_ * fVar137 + auVar64._8_4_ * auVar70._8_4_;
              auVar90._12_4_ = auVar276._12_4_ * fVar137 + auVar64._12_4_ * auVar70._12_4_;
              auVar205 = vsubps_avx(auVar205,auVar90);
              auVar70 = vandps_avx(auVar281,auVar63);
              auVar63 = vshufps_avx(auVar70,auVar70,0xf5);
              auVar70 = vmaxss_avx(auVar63,auVar70);
              if (auVar70._0_4_ < (float)local_2e8._0_4_) {
                local_218 = auVar205._0_4_;
                if ((0.0 <= local_218) && (local_218 <= 1.0)) {
                  auVar70 = vmovshdup_avx(auVar205);
                  fVar137 = auVar70._0_4_;
                  if ((0.0 <= fVar137) && (fVar137 <= 1.0)) {
                    auVar70 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar110 = vinsertps_avx(auVar70,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar70 = vdpps_avx(auVar110,local_478,0x7f);
                    auVar276 = vdpps_avx(auVar110,local_488,0x7f);
                    auVar64 = vdpps_avx(auVar110,local_2f8,0x7f);
                    auVar63 = vdpps_avx(auVar110,local_308,0x7f);
                    auVar98 = vdpps_avx(auVar110,local_318,0x7f);
                    auVar74 = vdpps_avx(auVar110,local_328,0x7f);
                    auVar75 = vdpps_avx(auVar110,local_338,0x7f);
                    auVar110 = vdpps_avx(auVar110,local_348,0x7f);
                    fVar153 = 1.0 - fVar137;
                    auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * auVar98._0_4_)),
                                              ZEXT416((uint)fVar153),auVar70);
                    auVar276 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * fVar137)),
                                               ZEXT416((uint)fVar153),auVar276);
                    auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar137)),
                                              ZEXT416((uint)fVar153),auVar64);
                    auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar137 * auVar110._0_4_)),
                                              ZEXT416((uint)fVar153),auVar63);
                    fVar97 = 1.0 - local_218;
                    fVar153 = fVar97 * local_218 * local_218 * 3.0;
                    fVar178 = local_218 * local_218 * local_218;
                    auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * auVar63._0_4_)),
                                              ZEXT416((uint)fVar153),auVar64);
                    fVar154 = local_218 * 3.0 * fVar97 * fVar97;
                    auVar276 = vfmadd231ss_fma(auVar64,ZEXT416((uint)fVar154),auVar276);
                    fVar96 = fVar97 * fVar97 * fVar97;
                    auVar70 = vfmadd231ss_fma(auVar276,ZEXT416((uint)fVar96),auVar70);
                    fVar62 = auVar70._0_4_;
                    if (((fVar60 <= fVar62) &&
                        (fVar155 = *(float *)(ray + k * 4 + 0x80), fVar62 <= fVar155)) &&
                       (pGVar5 = (context->scene->geometries).items[uVar50].ptr,
                       (pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                      auVar70 = vshufps_avx(auVar205,auVar205,0x55);
                      auVar223._8_4_ = 0x3f800000;
                      auVar223._0_8_ = &DAT_3f8000003f800000;
                      auVar223._12_4_ = 0x3f800000;
                      auVar276 = vsubps_avx(auVar223,auVar70);
                      fVar156 = auVar70._0_4_;
                      auVar232._0_4_ = fVar156 * (float)local_4a8._0_4_;
                      fVar157 = auVar70._4_4_;
                      auVar232._4_4_ = fVar157 * (float)local_4a8._4_4_;
                      fVar158 = auVar70._8_4_;
                      auVar232._8_4_ = fVar158 * fStack_4a0;
                      fVar177 = auVar70._12_4_;
                      auVar232._12_4_ = fVar177 * fStack_49c;
                      auVar244._0_4_ = fVar156 * (float)local_4f8._0_4_;
                      auVar244._4_4_ = fVar157 * (float)local_4f8._4_4_;
                      auVar244._8_4_ = fVar158 * fStack_4f0;
                      auVar244._12_4_ = fVar177 * fStack_4ec;
                      auVar254._0_4_ = fVar156 * (float)local_508._0_4_;
                      auVar254._4_4_ = fVar157 * (float)local_508._4_4_;
                      auVar254._8_4_ = fVar158 * fStack_500;
                      auVar254._12_4_ = fVar177 * fStack_4fc;
                      auVar268._0_4_ = fVar156 * (float)local_4c8._0_4_;
                      auVar268._4_4_ = fVar157 * (float)local_4c8._4_4_;
                      auVar268._8_4_ = fVar158 * fStack_4c0;
                      auVar268._12_4_ = fVar177 * fStack_4bc;
                      auVar64 = vfmadd231ps_fma(auVar232,auVar276,local_498);
                      auVar63 = vfmadd231ps_fma(auVar244,auVar276,local_4d8);
                      auVar98 = vfmadd231ps_fma(auVar254,auVar276,local_4e8);
                      auVar74 = vfmadd231ps_fma(auVar268,auVar276,local_4b8);
                      auVar276 = vsubps_avx(auVar63,auVar64);
                      auVar64 = vsubps_avx(auVar98,auVar63);
                      auVar63 = vsubps_avx(auVar74,auVar98);
                      auVar269._0_4_ = local_218 * auVar64._0_4_;
                      auVar269._4_4_ = local_218 * auVar64._4_4_;
                      auVar269._8_4_ = local_218 * auVar64._8_4_;
                      auVar269._12_4_ = local_218 * auVar64._12_4_;
                      auVar212._4_4_ = fVar97;
                      auVar212._0_4_ = fVar97;
                      auVar212._8_4_ = fVar97;
                      auVar212._12_4_ = fVar97;
                      auVar276 = vfmadd231ps_fma(auVar269,auVar212,auVar276);
                      auVar233._0_4_ = local_218 * auVar63._0_4_;
                      auVar233._4_4_ = local_218 * auVar63._4_4_;
                      auVar233._8_4_ = local_218 * auVar63._8_4_;
                      auVar233._12_4_ = local_218 * auVar63._12_4_;
                      auVar64 = vfmadd231ps_fma(auVar233,auVar212,auVar64);
                      auVar234._0_4_ = local_218 * auVar64._0_4_;
                      auVar234._4_4_ = local_218 * auVar64._4_4_;
                      auVar234._8_4_ = local_218 * auVar64._8_4_;
                      auVar234._12_4_ = local_218 * auVar64._12_4_;
                      auVar64 = vfmadd231ps_fma(auVar234,auVar212,auVar276);
                      auVar195._0_4_ = fVar178 * (float)local_398._0_4_;
                      auVar195._4_4_ = fVar178 * (float)local_398._4_4_;
                      auVar195._8_4_ = fVar178 * fStack_390;
                      auVar195._12_4_ = fVar178 * fStack_38c;
                      auVar133._4_4_ = fVar153;
                      auVar133._0_4_ = fVar153;
                      auVar133._8_4_ = fVar153;
                      auVar133._12_4_ = fVar153;
                      auVar276 = vfmadd132ps_fma(auVar133,auVar195,local_388);
                      auVar173._4_4_ = fVar154;
                      auVar173._0_4_ = fVar154;
                      auVar173._8_4_ = fVar154;
                      auVar173._12_4_ = fVar154;
                      auVar276 = vfmadd132ps_fma(auVar173,auVar276,local_378);
                      auVar196._0_4_ = auVar64._0_4_ * 3.0;
                      auVar196._4_4_ = auVar64._4_4_ * 3.0;
                      auVar196._8_4_ = auVar64._8_4_ * 3.0;
                      auVar196._12_4_ = auVar64._12_4_ * 3.0;
                      auVar150._4_4_ = fVar96;
                      auVar150._0_4_ = fVar96;
                      auVar150._8_4_ = fVar96;
                      auVar150._12_4_ = fVar96;
                      auVar64 = vfmadd132ps_fma(auVar150,auVar276,local_368);
                      auVar276 = vshufps_avx(auVar196,auVar196,0xc9);
                      auVar134._0_4_ = auVar64._0_4_ * auVar276._0_4_;
                      auVar134._4_4_ = auVar64._4_4_ * auVar276._4_4_;
                      auVar134._8_4_ = auVar64._8_4_ * auVar276._8_4_;
                      auVar134._12_4_ = auVar64._12_4_ * auVar276._12_4_;
                      auVar276 = vshufps_avx(auVar64,auVar64,0xc9);
                      auVar276 = vfmsub231ps_fma(auVar134,auVar196,auVar276);
                      local_228 = auVar276._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar62;
                        uVar61 = vextractps_avx(auVar276,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar61;
                        uVar61 = vextractps_avx(auVar276,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar61;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
                        *(float *)(ray + k * 4 + 0xf0) = local_218;
                        *(float *)(ray + k * 4 + 0x100) = fVar137;
                        *(uint *)(ray + k * 4 + 0x110) = uVar4;
                        *(uint *)(ray + k * 4 + 0x120) = uVar50;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar64 = vshufps_avx(auVar276,auVar276,0x55);
                        auVar276 = vshufps_avx(auVar276,auVar276,0xaa);
                        local_248[0] = (RTCHitN)auVar64[0];
                        local_248[1] = (RTCHitN)auVar64[1];
                        local_248[2] = (RTCHitN)auVar64[2];
                        local_248[3] = (RTCHitN)auVar64[3];
                        local_248[4] = (RTCHitN)auVar64[4];
                        local_248[5] = (RTCHitN)auVar64[5];
                        local_248[6] = (RTCHitN)auVar64[6];
                        local_248[7] = (RTCHitN)auVar64[7];
                        local_248[8] = (RTCHitN)auVar64[8];
                        local_248[9] = (RTCHitN)auVar64[9];
                        local_248[10] = (RTCHitN)auVar64[10];
                        local_248[0xb] = (RTCHitN)auVar64[0xb];
                        local_248[0xc] = (RTCHitN)auVar64[0xc];
                        local_248[0xd] = (RTCHitN)auVar64[0xd];
                        local_248[0xe] = (RTCHitN)auVar64[0xe];
                        local_248[0xf] = (RTCHitN)auVar64[0xf];
                        local_238 = auVar276;
                        uStack_224 = local_228;
                        uStack_220 = local_228;
                        uStack_21c = local_228;
                        fStack_214 = local_218;
                        fStack_210 = local_218;
                        fStack_20c = local_218;
                        local_208 = auVar70;
                        local_1f8 = CONCAT44(uStack_3c4,local_3c8);
                        uStack_1f0 = CONCAT44(uStack_3bc,uStack_3c0);
                        local_1e8._4_4_ = uStack_3b4;
                        local_1e8._0_4_ = local_3b8;
                        local_1e8._8_4_ = uStack_3b0;
                        local_1e8._12_4_ = uStack_3ac;
                        vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                        uStack_1d4 = context->user->instID[0];
                        local_1d8 = uStack_1d4;
                        uStack_1d0 = uStack_1d4;
                        uStack_1cc = uStack_1d4;
                        uStack_1c8 = context->user->instPrimID[0];
                        uStack_1c4 = uStack_1c8;
                        uStack_1c0 = uStack_1c8;
                        uStack_1bc = uStack_1c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar62;
                        local_558 = *local_540;
                        uStack_550 = local_540[1];
                        local_538.valid = (int *)&local_558;
                        local_538.geometryUserPtr = pGVar5->userPtr;
                        local_538.context = context->user;
                        local_538.hit = local_248;
                        local_538.N = 4;
                        local_538.ray = (RTCRayN *)ray;
                        if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar5->intersectionFilterN)(&local_538);
                          auVar94._8_56_ = extraout_var;
                          auVar94._0_8_ = extraout_XMM1_Qa;
                          auVar276 = auVar94._0_16_;
                        }
                        auVar45._8_8_ = uStack_550;
                        auVar45._0_8_ = local_558;
                        if (auVar45 == (undefined1  [16])0x0) {
                          auVar70 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar276 = vpcmpeqd_avx(auVar276,auVar276);
                          auVar70 = auVar70 ^ auVar276;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          auVar276 = vpcmpeqd_avx(auVar70,auVar70);
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var6)(&local_538);
                            auVar276 = vpcmpeqd_avx(auVar276,auVar276);
                          }
                          auVar46._8_8_ = uStack_550;
                          auVar46._0_8_ = local_558;
                          auVar64 = vpcmpeqd_avx(auVar46,_DAT_01feba10);
                          auVar70 = auVar64 ^ auVar276;
                          if (auVar46 != (undefined1  [16])0x0) {
                            auVar64 = auVar64 ^ auVar276;
                            auVar276 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])local_538.hit);
                            *(undefined1 (*) [16])(local_538.ray + 0xc0) = auVar276;
                            auVar276 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x10));
                            *(undefined1 (*) [16])(local_538.ray + 0xd0) = auVar276;
                            auVar276 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x20));
                            *(undefined1 (*) [16])(local_538.ray + 0xe0) = auVar276;
                            auVar276 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x30));
                            *(undefined1 (*) [16])(local_538.ray + 0xf0) = auVar276;
                            auVar276 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x40));
                            *(undefined1 (*) [16])(local_538.ray + 0x100) = auVar276;
                            auVar276 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x50));
                            *(undefined1 (*) [16])(local_538.ray + 0x110) = auVar276;
                            auVar276 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x60));
                            *(undefined1 (*) [16])(local_538.ray + 0x120) = auVar276;
                            auVar276 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x70));
                            *(undefined1 (*) [16])(local_538.ray + 0x130) = auVar276;
                            auVar276 = vmaskmovps_avx(auVar64,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x80));
                            *(undefined1 (*) [16])(local_538.ray + 0x140) = auVar276;
                          }
                        }
                        auVar91._8_8_ = 0x100000001;
                        auVar91._0_8_ = 0x100000001;
                        if ((auVar91 & auVar70) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar155;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar55 = lVar55 + -1;
            } while (lVar55 != 0);
          }
          else {
            bVar42 = false;
          }
        }
      }
    } while (bVar42);
    local_358 = vinsertps_avx(auVar9,ZEXT416((uint)fVar152),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }